

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  bool bVar51;
  bool bVar52;
  undefined1 auVar53 [12];
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  uint uVar86;
  uint uVar87;
  ulong uVar88;
  byte unaff_BL;
  long lVar89;
  ulong uVar90;
  undefined4 uVar91;
  ulong uVar92;
  ulong uVar93;
  float fVar94;
  float fVar123;
  float fVar125;
  vint4 bi_2;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar95;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar110 [32];
  float fVar124;
  float fVar126;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar137 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar142 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar179;
  float fVar180;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar181;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar163 [16];
  undefined1 auVar176 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  vint4 ai_2;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar215;
  float fVar217;
  vint4 ai;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar219;
  undefined1 auVar210 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar216;
  float fVar218;
  float fVar220;
  undefined1 auVar211 [32];
  undefined1 auVar209 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  vint4 bi;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar243;
  undefined1 auVar238 [16];
  undefined1 auVar237 [16];
  undefined1 auVar241 [32];
  float fVar244;
  undefined1 auVar242 [64];
  vint4 ai_1;
  undefined1 auVar258 [16];
  float fVar264;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar254;
  float fVar255;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar256;
  float fVar262;
  float fVar263;
  undefined1 auVar257 [16];
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar261 [64];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar272;
  undefined1 auVar270 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  float fVar279;
  float fVar280;
  float fVar288;
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [28];
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar297 [32];
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  float P_err;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_b91;
  undefined8 local_b00;
  undefined8 uStack_af8;
  ulong local_af0;
  float local_ae8;
  float local_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined8 *local_9d8;
  RTCFilterFunctionNArguments local_9d0;
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [48];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  Primitive *local_890;
  ulong local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined4 local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  undefined4 uStack_808;
  undefined4 uStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 auStack_770 [16];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  uint local_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  RTCHitN local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [16];
  uint local_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint uStack_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  undefined1 local_620 [32];
  ulong local_600;
  undefined1 auStack_5f8 [24];
  uint local_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  uint uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar271 [64];
  undefined1 auVar278 [64];
  undefined1 auVar287 [64];
  
  PVar2 = prim[1];
  uVar93 = (ulong)(byte)PVar2;
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar258 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar258 = vinsertps_avx(auVar258,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar94 = *(float *)(prim + uVar93 * 0x19 + 0x12);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar93 * 0x19 + 6));
  auVar96._0_4_ = fVar94 * auVar5._0_4_;
  auVar96._4_4_ = fVar94 * auVar5._4_4_;
  auVar96._8_4_ = fVar94 * auVar5._8_4_;
  auVar96._12_4_ = fVar94 * auVar5._12_4_;
  auVar221._0_4_ = fVar94 * auVar258._0_4_;
  auVar221._4_4_ = fVar94 * auVar258._4_4_;
  auVar221._8_4_ = fVar94 * auVar258._8_4_;
  auVar221._12_4_ = fVar94 * auVar258._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar258 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 5 + 6)));
  auVar258 = vcvtdq2ps_avx(auVar258);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 6 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0xb + 6)));
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar93 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  uVar92 = (ulong)(uint)((int)(uVar93 * 9) * 2);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 + uVar93 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar92 = (ulong)(uint)((int)(uVar93 * 5) << 2);
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 + 6)));
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar294._4_4_ = auVar221._0_4_;
  auVar294._0_4_ = auVar221._0_4_;
  auVar294._8_4_ = auVar221._0_4_;
  auVar294._12_4_ = auVar221._0_4_;
  auVar131 = vshufps_avx(auVar221,auVar221,0x55);
  auVar97 = vshufps_avx(auVar221,auVar221,0xaa);
  fVar94 = auVar97._0_4_;
  auVar273._0_4_ = fVar94 * auVar105._0_4_;
  fVar123 = auVar97._4_4_;
  auVar273._4_4_ = fVar123 * auVar105._4_4_;
  fVar279 = auVar97._8_4_;
  auVar273._8_4_ = fVar279 * auVar105._8_4_;
  fVar201 = auVar97._12_4_;
  auVar273._12_4_ = fVar201 * auVar105._12_4_;
  auVar268._0_4_ = auVar8._0_4_ * fVar94;
  auVar268._4_4_ = auVar8._4_4_ * fVar123;
  auVar268._8_4_ = auVar8._8_4_ * fVar279;
  auVar268._12_4_ = auVar8._12_4_ * fVar201;
  auVar245._0_4_ = auVar158._0_4_ * fVar94;
  auVar245._4_4_ = auVar158._4_4_ * fVar123;
  auVar245._8_4_ = auVar158._8_4_ * fVar279;
  auVar245._12_4_ = auVar158._12_4_ * fVar201;
  auVar97 = vfmadd231ps_fma(auVar273,auVar131,auVar258);
  auVar132 = vfmadd231ps_fma(auVar268,auVar131,auVar7);
  auVar131 = vfmadd231ps_fma(auVar245,auVar98,auVar131);
  auVar182 = vfmadd231ps_fma(auVar97,auVar294,auVar5);
  auVar132 = vfmadd231ps_fma(auVar132,auVar294,auVar234);
  auVar203 = vfmadd231ps_fma(auVar131,auVar99,auVar294);
  auVar295._4_4_ = auVar96._0_4_;
  auVar295._0_4_ = auVar96._0_4_;
  auVar295._8_4_ = auVar96._0_4_;
  auVar295._12_4_ = auVar96._0_4_;
  auVar131 = vshufps_avx(auVar96,auVar96,0x55);
  auVar97 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar94 = auVar97._0_4_;
  auVar222._0_4_ = fVar94 * auVar105._0_4_;
  fVar123 = auVar97._4_4_;
  auVar222._4_4_ = fVar123 * auVar105._4_4_;
  fVar279 = auVar97._8_4_;
  auVar222._8_4_ = fVar279 * auVar105._8_4_;
  fVar201 = auVar97._12_4_;
  auVar222._12_4_ = fVar201 * auVar105._12_4_;
  auVar130._0_4_ = auVar8._0_4_ * fVar94;
  auVar130._4_4_ = auVar8._4_4_ * fVar123;
  auVar130._8_4_ = auVar8._8_4_ * fVar279;
  auVar130._12_4_ = auVar8._12_4_ * fVar201;
  auVar97._0_4_ = auVar158._0_4_ * fVar94;
  auVar97._4_4_ = auVar158._4_4_ * fVar123;
  auVar97._8_4_ = auVar158._8_4_ * fVar279;
  auVar97._12_4_ = auVar158._12_4_ * fVar201;
  auVar258 = vfmadd231ps_fma(auVar222,auVar131,auVar258);
  auVar105 = vfmadd231ps_fma(auVar130,auVar131,auVar7);
  auVar7 = vfmadd231ps_fma(auVar97,auVar131,auVar98);
  auVar8 = vfmadd231ps_fma(auVar258,auVar295,auVar5);
  auVar98 = vfmadd231ps_fma(auVar105,auVar295,auVar234);
  auVar158 = vfmadd231ps_fma(auVar7,auVar295,auVar99);
  local_ab0._8_4_ = 0x7fffffff;
  local_ab0._0_8_ = 0x7fffffff7fffffff;
  local_ab0._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar182,local_ab0);
  auVar202._8_4_ = 0x219392ef;
  auVar202._0_8_ = 0x219392ef219392ef;
  auVar202._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar202,1);
  auVar258 = vblendvps_avx(auVar182,auVar202,auVar5);
  auVar5 = vandps_avx(auVar132,local_ab0);
  auVar5 = vcmpps_avx(auVar5,auVar202,1);
  auVar105 = vblendvps_avx(auVar132,auVar202,auVar5);
  auVar5 = vandps_avx(auVar203,local_ab0);
  auVar5 = vcmpps_avx(auVar5,auVar202,1);
  auVar5 = vblendvps_avx(auVar203,auVar202,auVar5);
  auVar234 = vrcpps_avx(auVar258);
  auVar237._8_4_ = 0x3f800000;
  auVar237._0_8_ = &DAT_3f8000003f800000;
  auVar237._12_4_ = 0x3f800000;
  auVar258 = vfnmadd213ps_fma(auVar258,auVar234,auVar237);
  auVar234 = vfmadd132ps_fma(auVar258,auVar234,auVar234);
  auVar258 = vrcpps_avx(auVar105);
  auVar105 = vfnmadd213ps_fma(auVar105,auVar258,auVar237);
  auVar7 = vfmadd132ps_fma(auVar105,auVar258,auVar258);
  auVar258 = vrcpps_avx(auVar5);
  auVar105 = vfnmadd213ps_fma(auVar5,auVar258,auVar237);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar93 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar99 = vfmadd132ps_fma(auVar105,auVar258,auVar258);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar8);
  auVar203._0_4_ = auVar234._0_4_ * auVar5._0_4_;
  auVar203._4_4_ = auVar234._4_4_ * auVar5._4_4_;
  auVar203._8_4_ = auVar234._8_4_ * auVar5._8_4_;
  auVar203._12_4_ = auVar234._12_4_ * auVar5._12_4_;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = *(ulong *)(prim + uVar93 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar258);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar8);
  auVar223._0_4_ = auVar234._0_4_ * auVar5._0_4_;
  auVar223._4_4_ = auVar234._4_4_ * auVar5._4_4_;
  auVar223._8_4_ = auVar234._8_4_ * auVar5._8_4_;
  auVar223._12_4_ = auVar234._12_4_ * auVar5._12_4_;
  auVar132._1_3_ = 0;
  auVar132[0] = PVar2;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar258 = vpmovsxwd_avx(auVar105);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar93 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar234);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar98);
  auVar246._0_4_ = auVar5._0_4_ * auVar7._0_4_;
  auVar246._4_4_ = auVar5._4_4_ * auVar7._4_4_;
  auVar246._8_4_ = auVar5._8_4_ * auVar7._8_4_;
  auVar246._12_4_ = auVar5._12_4_ * auVar7._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar258);
  auVar5 = vsubps_avx(auVar5,auVar98);
  auVar131._0_4_ = auVar7._0_4_ * auVar5._0_4_;
  auVar131._4_4_ = auVar7._4_4_ * auVar5._4_4_;
  auVar131._8_4_ = auVar7._8_4_ * auVar5._8_4_;
  auVar131._12_4_ = auVar7._12_4_ * auVar5._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar92 + uVar93 + 6);
  auVar5 = vpmovsxwd_avx(auVar7);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar158);
  auVar182._0_4_ = auVar99._0_4_ * auVar5._0_4_;
  auVar182._4_4_ = auVar99._4_4_ * auVar5._4_4_;
  auVar182._8_4_ = auVar99._8_4_ * auVar5._8_4_;
  auVar182._12_4_ = auVar99._12_4_ * auVar5._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar93 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar158);
  auVar98._0_4_ = auVar99._0_4_ * auVar5._0_4_;
  auVar98._4_4_ = auVar99._4_4_ * auVar5._4_4_;
  auVar98._8_4_ = auVar99._8_4_ * auVar5._8_4_;
  auVar98._12_4_ = auVar99._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar203,auVar223);
  auVar258 = vpminsd_avx(auVar246,auVar131);
  auVar5 = vmaxps_avx(auVar5,auVar258);
  auVar258 = vpminsd_avx(auVar182,auVar98);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar257._4_4_ = uVar91;
  auVar257._0_4_ = uVar91;
  auVar257._8_4_ = uVar91;
  auVar257._12_4_ = uVar91;
  auVar258 = vmaxps_avx(auVar258,auVar257);
  auVar5 = vmaxps_avx(auVar5,auVar258);
  local_4b0._0_4_ = auVar5._0_4_ * 0.99999964;
  local_4b0._4_4_ = auVar5._4_4_ * 0.99999964;
  local_4b0._8_4_ = auVar5._8_4_ * 0.99999964;
  local_4b0._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar203,auVar223);
  auVar258 = vpmaxsd_avx(auVar246,auVar131);
  auVar5 = vminps_avx(auVar5,auVar258);
  auVar258 = vpmaxsd_avx(auVar182,auVar98);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar158._4_4_ = uVar91;
  auVar158._0_4_ = uVar91;
  auVar158._8_4_ = uVar91;
  auVar158._12_4_ = uVar91;
  auVar258 = vminps_avx(auVar258,auVar158);
  auVar5 = vminps_avx(auVar5,auVar258);
  auVar99._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar99._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar99._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar99._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar132[4] = PVar2;
  auVar132._5_3_ = 0;
  auVar132[8] = PVar2;
  auVar132._9_3_ = 0;
  auVar132[0xc] = PVar2;
  auVar132._13_3_ = 0;
  auVar258 = vpcmpgtd_avx(auVar132,_DAT_01ff0cf0);
  auVar5 = vcmpps_avx(local_4b0,auVar99,2);
  auVar5 = vandps_avx(auVar5,auVar258);
  uVar86 = vmovmskps_avx(auVar5);
  local_b91 = uVar86 != 0;
  if (uVar86 == 0) {
    return local_b91;
  }
  uVar86 = uVar86 & 0xff;
  auVar119._16_16_ = mm_lookupmask_ps._240_16_;
  auVar119._0_16_ = mm_lookupmask_ps._240_16_;
  local_280 = vblendps_avx(auVar119,ZEXT832(0) << 0x20,0x80);
  local_9d8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_820 = 0x7fffffff;
  uStack_81c = 0x7fffffff;
  uStack_818 = 0x7fffffff;
  uStack_814 = 0x7fffffff;
  uStack_810 = 0x7fffffff;
  uStack_80c = 0x7fffffff;
  uStack_808 = 0x7fffffff;
  uStack_804 = 0x7fffffff;
  local_5e0 = 0x80000000;
  uStack_5dc = 0x80000000;
  uStack_5d8 = 0x80000000;
  uStack_5d4 = 0x80000000;
  fStack_5d0 = -0.0;
  fStack_5cc = -0.0;
  fStack_5c8 = -0.0;
  uStack_5c4 = 0x80000000;
  local_890 = prim;
LAB_01704620:
  lVar89 = 0;
  local_888 = (ulong)uVar86;
  for (uVar92 = local_888; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
    lVar89 = lVar89 + 1;
  }
  local_6d0 = *(uint *)(local_890 + 2);
  local_af0 = (ulong)local_6d0;
  local_6e0 = *(uint *)(local_890 + lVar89 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[local_af0].ptr;
  uVar92 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_6e0);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar89 = *(long *)&pGVar3[1].time_range.upper;
  auVar5 = *(undefined1 (*) [16])(lVar89 + (long)p_Var4 * uVar92);
  auVar258 = *(undefined1 (*) [16])(lVar89 + (uVar92 + 1) * (long)p_Var4);
  auVar105 = *(undefined1 (*) [16])(lVar89 + (uVar92 + 2) * (long)p_Var4);
  local_888 = local_888 - 1 & local_888;
  auVar234 = *(undefined1 (*) [16])(lVar89 + (uVar92 + 3) * (long)p_Var4);
  if (local_888 != 0) {
    uVar93 = local_888 - 1 & local_888;
    for (uVar92 = local_888; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
    }
    if (uVar93 != 0) {
      for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar8 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar269._4_4_ = uVar91;
  auVar269._0_4_ = uVar91;
  auVar269._8_4_ = uVar91;
  auVar269._12_4_ = uVar91;
  fStack_a30 = (float)uVar91;
  _local_a40 = auVar269;
  fStack_a2c = (float)uVar91;
  fStack_a28 = (float)uVar91;
  register0x0000149c = uVar91;
  auVar271 = ZEXT3264(_local_a40);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar274._4_4_ = uVar91;
  auVar274._0_4_ = uVar91;
  auVar274._8_4_ = uVar91;
  auVar274._12_4_ = uVar91;
  fStack_7f0 = (float)uVar91;
  _local_800 = auVar274;
  fStack_7ec = (float)uVar91;
  fStack_7e8 = (float)uVar91;
  register0x000014dc = uVar91;
  auVar278 = ZEXT3264(_local_800);
  auVar7 = vunpcklps_avx(auVar269,auVar274);
  fVar94 = *(float *)(ray + k * 4 + 0x60);
  auVar281._4_4_ = fVar94;
  auVar281._0_4_ = fVar94;
  auVar281._8_4_ = fVar94;
  auVar281._12_4_ = fVar94;
  fStack_970 = fVar94;
  _local_980 = auVar281;
  fStack_96c = fVar94;
  fStack_968 = fVar94;
  register0x0000151c = fVar94;
  auVar287 = ZEXT3264(_local_980);
  local_930 = vinsertps_avx(auVar7,auVar281,0x28);
  auVar224._0_4_ = (auVar5._0_4_ + auVar258._0_4_ + auVar105._0_4_ + auVar234._0_4_) * 0.25;
  auVar224._4_4_ = (auVar5._4_4_ + auVar258._4_4_ + auVar105._4_4_ + auVar234._4_4_) * 0.25;
  auVar224._8_4_ = (auVar5._8_4_ + auVar258._8_4_ + auVar105._8_4_ + auVar234._8_4_) * 0.25;
  auVar224._12_4_ = (auVar5._12_4_ + auVar258._12_4_ + auVar105._12_4_ + auVar234._12_4_) * 0.25;
  auVar7 = vsubps_avx(auVar224,auVar8);
  auVar7 = vdpps_avx(auVar7,local_930,0x7f);
  local_940 = vdpps_avx(local_930,local_930,0x7f);
  auVar261 = ZEXT1664(local_940);
  auVar99 = vrcpss_avx(local_940,local_940);
  auVar98 = vfnmadd213ss_fma(auVar99,local_940,ZEXT416(0x40000000));
  auVar242 = ZEXT1664(auVar98);
  fVar123 = auVar7._0_4_ * auVar99._0_4_ * auVar98._0_4_;
  auVar232._4_4_ = fVar123;
  auVar232._0_4_ = fVar123;
  auVar232._8_4_ = fVar123;
  auVar232._12_4_ = fVar123;
  auVar7 = vfmadd231ps_fma(auVar8,local_930,auVar232);
  auVar7 = vblendps_avx(auVar7,_DAT_01feba10,8);
  local_a70 = vsubps_avx(auVar5,auVar7);
  local_a80 = vsubps_avx(auVar105,auVar7);
  local_a90 = vsubps_avx(auVar258,auVar7);
  _local_aa0 = vsubps_avx(auVar234,auVar7);
  auVar5 = vmovshdup_avx(local_a70);
  local_1a0 = auVar5._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar5 = vshufps_avx(local_a70,local_a70,0xaa);
  local_1c0 = auVar5._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar5 = vshufps_avx(local_a70,local_a70,0xff);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vmovshdup_avx(local_a90);
  local_360 = auVar5._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar5 = vshufps_avx(local_a90,local_a90,0xaa);
  local_380 = auVar5._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar5 = vshufps_avx(local_a90,local_a90,0xff);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vmovshdup_avx(local_a80);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar5 = vshufps_avx(local_a80,local_a80,0xaa);
  local_3a0 = auVar5._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar5 = vshufps_avx(local_a80,local_a80,0xff);
  local_3c0 = auVar5._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar5 = vmovshdup_avx(_local_aa0);
  local_3e0 = auVar5._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar5 = vshufps_avx(_local_aa0,_local_aa0,0xaa);
  local_400 = auVar5._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar5 = vshufps_avx(_local_aa0,_local_aa0,0xff);
  local_420 = auVar5._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar94 * fVar94)),_local_800,_local_800);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_a40,_local_a40);
  uVar91 = auVar5._0_4_;
  local_240._4_4_ = uVar91;
  local_240._0_4_ = uVar91;
  local_240._8_4_ = uVar91;
  local_240._12_4_ = uVar91;
  local_240._16_4_ = uVar91;
  local_240._20_4_ = uVar91;
  local_240._24_4_ = uVar91;
  local_240._28_4_ = uVar91;
  auVar214 = ZEXT3264(local_240);
  fVar94 = *(float *)(ray + k * 4 + 0x30);
  local_8b0 = ZEXT416((uint)fVar123);
  local_2a0 = fVar94 - fVar123;
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  uVar92 = 1;
  uVar90 = 0;
  local_440 = local_a70._0_4_;
  uStack_43c = local_440;
  uStack_438 = local_440;
  uStack_434 = local_440;
  uStack_430 = local_440;
  uStack_42c = local_440;
  uStack_428 = local_440;
  uStack_424 = local_440;
  local_260 = local_a90._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_460 = local_a80._0_4_;
  uStack_45c = local_460;
  uStack_458 = local_460;
  uStack_454 = local_460;
  uStack_450 = local_460;
  uStack_44c = local_460;
  uStack_448 = local_460;
  uStack_444 = local_460;
  local_480 = local_aa0._0_4_;
  auVar230._4_4_ = uStack_81c;
  auVar230._0_4_ = local_820;
  auVar230._8_4_ = uStack_818;
  auVar230._12_4_ = uStack_814;
  auVar230._16_4_ = uStack_810;
  auVar230._20_4_ = uStack_80c;
  auVar230._24_4_ = uStack_808;
  auVar230._28_4_ = uStack_804;
  local_4a0 = vandps_avx(local_240,auVar230);
  auVar5 = vsqrtss_avx(local_940,local_940);
  local_ae4 = auVar5._0_4_;
  auVar5 = vsqrtss_avx(local_940,local_940);
  local_ae8 = auVar5._0_4_;
  local_8a0 = ZEXT816(0x3f80000000000000);
  fStack_47c = local_480;
  fStack_478 = local_480;
  fStack_474 = local_480;
  fStack_470 = local_480;
  fStack_46c = local_480;
  fStack_468 = local_480;
  fStack_464 = local_480;
  uVar93 = 0;
  fVar279 = 0.0;
  uStack_6dc = local_6e0;
  uStack_6d8 = local_6e0;
  uStack_6d4 = local_6e0;
  uStack_6cc = local_6d0;
  uStack_6c8 = local_6d0;
  uStack_6c4 = local_6d0;
  do {
    auVar5 = vmovshdup_avx(local_8a0);
    fVar215 = local_8a0._0_4_;
    fVar201 = auVar5._0_4_ - fVar215;
    fVar280 = fVar201 * 0.04761905;
    local_9a0._4_4_ = fVar215;
    local_9a0._0_4_ = fVar215;
    local_9a0._8_4_ = fVar215;
    local_9a0._12_4_ = fVar215;
    local_9a0._16_4_ = fVar215;
    local_9a0._20_4_ = fVar215;
    local_9a0._24_4_ = fVar215;
    local_9a0._28_4_ = fVar215;
    local_720._4_4_ = fVar201;
    local_720._0_4_ = fVar201;
    local_720._8_4_ = fVar201;
    local_720._12_4_ = fVar201;
    local_720._16_4_ = fVar201;
    local_720._20_4_ = fVar201;
    local_720._24_4_ = fVar201;
    local_720._28_4_ = fVar201;
    auVar5 = vfmadd231ps_fma(local_9a0,local_720,_DAT_02020f20);
    auVar110._8_4_ = 0x3f800000;
    auVar110._0_8_ = &DAT_3f8000003f800000;
    auVar110._12_4_ = 0x3f800000;
    auVar110._16_4_ = 0x3f800000;
    auVar110._20_4_ = 0x3f800000;
    auVar110._24_4_ = 0x3f800000;
    auVar110._28_4_ = 0x3f800000;
    auVar119 = vsubps_avx(auVar110,ZEXT1632(auVar5));
    fVar201 = auVar119._0_4_;
    fVar217 = auVar119._4_4_;
    fVar216 = auVar119._8_4_;
    fVar254 = auVar119._12_4_;
    fVar244 = auVar119._16_4_;
    fVar255 = auVar119._20_4_;
    fVar220 = auVar119._24_4_;
    fVar95 = fVar201 * fVar201 * fVar201;
    fVar124 = fVar217 * fVar217 * fVar217;
    fVar125 = fVar216 * fVar216 * fVar216;
    fVar126 = fVar254 * fVar254 * fVar254;
    fVar127 = fVar244 * fVar244 * fVar244;
    fVar128 = fVar255 * fVar255 * fVar255;
    fVar129 = fVar220 * fVar220 * fVar220;
    fVar215 = auVar5._0_4_;
    fVar219 = auVar5._4_4_;
    fVar243 = auVar5._8_4_;
    fVar218 = auVar5._12_4_;
    fVar157 = fVar215 * fVar215 * fVar215;
    fVar179 = fVar219 * fVar219 * fVar219;
    fVar180 = fVar243 * fVar243 * fVar243;
    fVar181 = fVar218 * fVar218 * fVar218;
    fVar256 = fVar201 * fVar215;
    fVar262 = fVar217 * fVar219;
    fVar263 = fVar216 * fVar243;
    fVar264 = fVar254 * fVar218;
    fVar265 = fVar244 * 0.0;
    fVar266 = fVar255 * 0.0;
    fVar267 = fVar220 * 0.0;
    fVar272 = auVar271._28_4_ + auVar287._28_4_ + 1.0;
    fVar288 = auVar278._28_4_;
    auVar6._4_4_ = fVar124 * 0.16666667;
    auVar6._0_4_ = fVar95 * 0.16666667;
    auVar6._8_4_ = fVar125 * 0.16666667;
    auVar6._12_4_ = fVar126 * 0.16666667;
    auVar6._16_4_ = fVar127 * 0.16666667;
    auVar6._20_4_ = fVar128 * 0.16666667;
    auVar6._24_4_ = fVar129 * 0.16666667;
    auVar6._28_4_ = fVar272;
    auVar9._4_4_ = (fVar217 * fVar262 * 12.0 + fVar262 * fVar219 * 6.0 + fVar179 + fVar124 * 4.0) *
                   0.16666667;
    auVar9._0_4_ = (fVar201 * fVar256 * 12.0 + fVar256 * fVar215 * 6.0 + fVar157 + fVar95 * 4.0) *
                   0.16666667;
    auVar9._8_4_ = (fVar216 * fVar263 * 12.0 + fVar263 * fVar243 * 6.0 + fVar180 + fVar125 * 4.0) *
                   0.16666667;
    auVar9._12_4_ =
         (fVar254 * fVar264 * 12.0 + fVar264 * fVar218 * 6.0 + fVar181 + fVar126 * 4.0) * 0.16666667
    ;
    auVar9._16_4_ =
         (fVar244 * fVar265 * 12.0 + fVar265 * 0.0 * 6.0 + fVar127 * 4.0 + 0.0) * 0.16666667;
    auVar9._20_4_ =
         (fVar255 * fVar266 * 12.0 + fVar266 * 0.0 * 6.0 + fVar128 * 4.0 + 0.0) * 0.16666667;
    auVar9._24_4_ =
         (fVar220 * fVar267 * 12.0 + fVar267 * 0.0 * 6.0 + fVar129 * 4.0 + 0.0) * 0.16666667;
    auVar9._28_4_ = fVar288;
    auVar11._4_4_ =
         (fVar179 * 4.0 + fVar124 + fVar262 * fVar219 * 12.0 + fVar217 * fVar262 * 6.0) * 0.16666667
    ;
    auVar11._0_4_ =
         (fVar157 * 4.0 + fVar95 + fVar256 * fVar215 * 12.0 + fVar201 * fVar256 * 6.0) * 0.16666667;
    auVar11._8_4_ =
         (fVar180 * 4.0 + fVar125 + fVar263 * fVar243 * 12.0 + fVar216 * fVar263 * 6.0) * 0.16666667
    ;
    auVar11._12_4_ =
         (fVar181 * 4.0 + fVar126 + fVar264 * fVar218 * 12.0 + fVar254 * fVar264 * 6.0) * 0.16666667
    ;
    auVar11._16_4_ = (fVar127 + 0.0 + fVar265 * 0.0 * 12.0 + fVar244 * fVar265 * 6.0) * 0.16666667;
    auVar11._20_4_ = (fVar128 + 0.0 + fVar266 * 0.0 * 12.0 + fVar255 * fVar266 * 6.0) * 0.16666667;
    auVar11._24_4_ = (fVar129 + 0.0 + fVar267 * 0.0 * 12.0 + fVar220 * fVar267 * 6.0) * 0.16666667;
    auVar11._28_4_ = auVar287._28_4_;
    fVar157 = fVar157 * 0.16666667;
    fVar179 = fVar179 * 0.16666667;
    fVar180 = fVar180 * 0.16666667;
    fVar181 = fVar181 * 0.16666667;
    auVar146._4_4_ = fStack_47c * fVar179;
    auVar146._0_4_ = local_480 * fVar157;
    auVar146._8_4_ = fStack_478 * fVar180;
    auVar146._12_4_ = fStack_474 * fVar181;
    auVar146._16_4_ = fStack_470 * 0.0;
    auVar146._20_4_ = fStack_46c * 0.0;
    auVar146._24_4_ = fStack_468 * 0.0;
    auVar146._28_4_ = 0x3f800000;
    auVar12._4_4_ = fVar179 * local_3e0._4_4_;
    auVar12._0_4_ = fVar157 * (float)local_3e0;
    auVar12._8_4_ = fVar180 * (float)uStack_3d8;
    auVar12._12_4_ = fVar181 * uStack_3d8._4_4_;
    auVar12._16_4_ = (float)uStack_3d0 * 0.0;
    auVar12._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar12._24_4_ = (float)uStack_3c8 * 0.0;
    auVar12._28_4_ = 0x40800000;
    auVar116._4_4_ = fVar179 * local_400._4_4_;
    auVar116._0_4_ = fVar157 * (float)local_400;
    auVar116._8_4_ = fVar180 * (float)uStack_3f8;
    auVar116._12_4_ = fVar181 * uStack_3f8._4_4_;
    auVar116._16_4_ = (float)uStack_3f0 * 0.0;
    auVar116._20_4_ = uStack_3f0._4_4_ * 0.0;
    auVar116._24_4_ = (float)uStack_3e8 * 0.0;
    auVar116._28_4_ = 0x3e2aaaab;
    auVar13._4_4_ = fVar179 * local_420._4_4_;
    auVar13._0_4_ = fVar157 * (float)local_420;
    auVar13._8_4_ = fVar180 * (float)uStack_418;
    auVar13._12_4_ = fVar181 * uStack_418._4_4_;
    auVar13._16_4_ = (float)uStack_410 * 0.0;
    auVar13._20_4_ = uStack_410._4_4_ * 0.0;
    auVar13._24_4_ = (float)uStack_408 * 0.0;
    auVar13._28_4_ = fVar272 + fVar288 + fVar279;
    auVar111._4_4_ = uStack_45c;
    auVar111._0_4_ = local_460;
    auVar111._8_4_ = uStack_458;
    auVar111._12_4_ = uStack_454;
    auVar111._16_4_ = uStack_450;
    auVar111._20_4_ = uStack_44c;
    auVar111._24_4_ = uStack_448;
    auVar111._28_4_ = uStack_444;
    auVar5 = vfmadd231ps_fma(auVar146,auVar11,auVar111);
    auVar81._8_8_ = uStack_218;
    auVar81._0_8_ = local_220;
    auVar81._16_8_ = uStack_210;
    auVar81._24_8_ = uStack_208;
    auVar258 = vfmadd231ps_fma(auVar12,auVar11,auVar81);
    auVar73._8_8_ = uStack_398;
    auVar73._0_8_ = local_3a0;
    auVar73._16_8_ = uStack_390;
    auVar73._24_8_ = uStack_388;
    auVar105 = vfmadd231ps_fma(auVar116,auVar11,auVar73);
    auVar71._8_8_ = uStack_3b8;
    auVar71._0_8_ = local_3c0;
    auVar71._16_8_ = uStack_3b0;
    auVar71._24_8_ = uStack_3a8;
    auVar234 = vfmadd231ps_fma(auVar13,auVar11,auVar71);
    auVar80._4_4_ = uStack_25c;
    auVar80._0_4_ = local_260;
    auVar80._8_4_ = uStack_258;
    auVar80._12_4_ = uStack_254;
    auVar80._16_4_ = uStack_250;
    auVar80._20_4_ = uStack_24c;
    auVar80._24_4_ = uStack_248;
    auVar80._28_4_ = uStack_244;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar9,auVar80);
    auVar77._8_8_ = uStack_358;
    auVar77._0_8_ = local_360;
    auVar77._16_8_ = uStack_350;
    auVar77._24_8_ = uStack_348;
    auVar258 = vfmadd231ps_fma(ZEXT1632(auVar258),auVar9,auVar77);
    auVar75._8_8_ = uStack_378;
    auVar75._0_8_ = local_380;
    auVar75._16_8_ = uStack_370;
    auVar75._24_8_ = uStack_368;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar9,auVar75);
    auVar82._8_8_ = uStack_1f8;
    auVar82._0_8_ = local_200;
    auVar82._16_8_ = uStack_1f0;
    auVar82._24_8_ = uStack_1e8;
    auVar234 = vfmadd231ps_fma(ZEXT1632(auVar234),auVar82,auVar9);
    auVar197._4_4_ = uStack_43c;
    auVar197._0_4_ = local_440;
    auVar197._8_4_ = uStack_438;
    auVar197._12_4_ = uStack_434;
    auVar197._16_4_ = uStack_430;
    auVar197._20_4_ = uStack_42c;
    auVar197._24_4_ = uStack_428;
    auVar197._28_4_ = uStack_424;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar6,auVar197);
    auVar111 = ZEXT1632(auVar5);
    auVar85._8_8_ = uStack_198;
    auVar85._0_8_ = local_1a0;
    auVar85._16_8_ = uStack_190;
    auVar85._24_8_ = uStack_188;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar258),auVar6,auVar85);
    auVar197 = ZEXT1632(auVar5);
    auVar84._8_8_ = uStack_1b8;
    auVar84._0_8_ = local_1c0;
    auVar84._16_8_ = uStack_1b0;
    auVar84._24_8_ = uStack_1a8;
    auVar258 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar6,auVar84);
    auVar83._8_8_ = uStack_1d8;
    auVar83._0_8_ = local_1e0;
    auVar83._16_8_ = uStack_1d0;
    auVar83._24_8_ = uStack_1c8;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar234),auVar83,auVar6);
    auVar235._0_4_ = (float)((uint)fVar215 ^ local_5e0) * fVar215;
    auVar235._4_4_ = (float)((uint)fVar219 ^ uStack_5dc) * fVar219;
    auVar235._8_4_ = (float)((uint)fVar243 ^ uStack_5d8) * fVar243;
    auVar235._12_4_ = (float)((uint)fVar218 ^ uStack_5d4) * fVar218;
    auVar235._16_4_ = fStack_5d0 * 0.0;
    auVar235._20_4_ = fStack_5cc * 0.0;
    auVar235._24_4_ = fStack_5c8 * 0.0;
    auVar235._28_4_ = 0;
    auVar260._4_4_ = fVar262 * 4.0;
    auVar260._0_4_ = fVar256 * 4.0;
    auVar260._8_4_ = fVar263 * 4.0;
    auVar260._12_4_ = fVar264 * 4.0;
    auVar260._16_4_ = fVar265 * 4.0;
    auVar260._20_4_ = fVar266 * 4.0;
    fVar279 = auVar261._28_4_;
    auVar260._24_4_ = fVar267 * 4.0;
    auVar260._28_4_ = fVar279;
    auVar230 = vsubps_avx(auVar235,auVar260);
    auVar15._4_4_ = fVar217 * (float)((uint)fVar217 ^ uStack_5dc) * 0.5;
    auVar15._0_4_ = fVar201 * (float)((uint)fVar201 ^ local_5e0) * 0.5;
    auVar15._8_4_ = fVar216 * (float)((uint)fVar216 ^ uStack_5d8) * 0.5;
    auVar15._12_4_ = fVar254 * (float)((uint)fVar254 ^ uStack_5d4) * 0.5;
    auVar15._16_4_ = fVar244 * (float)((uint)fVar244 ^ (uint)fStack_5d0) * 0.5;
    auVar15._20_4_ = fVar255 * (float)((uint)fVar255 ^ (uint)fStack_5cc) * 0.5;
    auVar15._24_4_ = fVar220 * (float)((uint)fVar220 ^ (uint)fStack_5c8) * 0.5;
    auVar15._28_4_ = auVar119._28_4_;
    auVar16._4_4_ = auVar230._4_4_ * 0.5;
    auVar16._0_4_ = auVar230._0_4_ * 0.5;
    auVar16._8_4_ = auVar230._8_4_ * 0.5;
    auVar16._12_4_ = auVar230._12_4_ * 0.5;
    auVar16._16_4_ = auVar230._16_4_ * 0.5;
    auVar16._20_4_ = auVar230._20_4_ * 0.5;
    auVar16._24_4_ = auVar230._24_4_ * 0.5;
    auVar16._28_4_ = auVar230._28_4_;
    auVar229._4_4_ = (fVar262 * 4.0 + fVar217 * fVar217) * 0.5;
    auVar229._0_4_ = (fVar256 * 4.0 + fVar201 * fVar201) * 0.5;
    auVar229._8_4_ = (fVar263 * 4.0 + fVar216 * fVar216) * 0.5;
    auVar229._12_4_ = (fVar264 * 4.0 + fVar254 * fVar254) * 0.5;
    auVar229._16_4_ = (fVar265 * 4.0 + fVar244 * fVar244) * 0.5;
    auVar229._20_4_ = (fVar266 * 4.0 + fVar255 * fVar255) * 0.5;
    auVar229._24_4_ = (fVar267 * 4.0 + fVar220 * fVar220) * 0.5;
    auVar229._28_4_ = fVar279 + auVar242._28_4_;
    fVar201 = fVar215 * fVar215 * 0.5;
    fVar215 = fVar219 * fVar219 * 0.5;
    fVar217 = fVar243 * fVar243 * 0.5;
    fVar219 = fVar218 * fVar218 * 0.5;
    auVar270._4_4_ = fVar215 * fStack_47c;
    auVar270._0_4_ = fVar201 * local_480;
    auVar270._8_4_ = fVar217 * fStack_478;
    auVar270._12_4_ = fVar219 * fStack_474;
    auVar270._16_4_ = fStack_470 * 0.0;
    auVar270._20_4_ = fStack_46c * 0.0;
    auVar270._24_4_ = fStack_468 * 0.0;
    auVar270._28_4_ = fVar279;
    auVar240._4_4_ = fVar215 * local_3e0._4_4_;
    auVar240._0_4_ = fVar201 * (float)local_3e0;
    auVar240._8_4_ = fVar217 * (float)uStack_3d8;
    auVar240._12_4_ = fVar219 * uStack_3d8._4_4_;
    auVar240._16_4_ = (float)uStack_3d0 * 0.0;
    auVar240._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar240._24_4_ = (float)uStack_3c8 * 0.0;
    auVar240._28_4_ = uStack_5c4;
    auVar289._4_4_ = fVar215 * local_400._4_4_;
    auVar289._0_4_ = fVar201 * (float)local_400;
    auVar289._8_4_ = fVar217 * (float)uStack_3f8;
    auVar289._12_4_ = fVar219 * uStack_3f8._4_4_;
    auVar289._16_4_ = (float)uStack_3f0 * 0.0;
    auVar289._20_4_ = uStack_3f0._4_4_ * 0.0;
    auVar289._24_4_ = (float)uStack_3e8 * 0.0;
    auVar289._28_4_ = fVar288;
    auVar297._4_4_ = fVar215 * local_420._4_4_;
    auVar297._0_4_ = fVar201 * (float)local_420;
    auVar297._8_4_ = fVar217 * (float)uStack_418;
    auVar297._12_4_ = fVar219 * uStack_418._4_4_;
    auVar297._16_4_ = (float)uStack_410 * 0.0;
    auVar297._20_4_ = uStack_410._4_4_ * 0.0;
    auVar297._24_4_ = (float)uStack_408 * 0.0;
    auVar297._28_4_ = auVar214._28_4_;
    auVar69._4_4_ = uStack_45c;
    auVar69._0_4_ = local_460;
    auVar69._8_4_ = uStack_458;
    auVar69._12_4_ = uStack_454;
    auVar69._16_4_ = uStack_450;
    auVar69._20_4_ = uStack_44c;
    auVar69._24_4_ = uStack_448;
    auVar69._28_4_ = uStack_444;
    auVar5 = vfmadd231ps_fma(auVar270,auVar229,auVar69);
    auVar234 = vfmadd231ps_fma(auVar240,auVar229,auVar81);
    auVar74._8_8_ = uStack_398;
    auVar74._0_8_ = local_3a0;
    auVar74._16_8_ = uStack_390;
    auVar74._24_8_ = uStack_388;
    auVar7 = vfmadd231ps_fma(auVar289,auVar229,auVar74);
    auVar72._8_8_ = uStack_3b8;
    auVar72._0_8_ = local_3c0;
    auVar72._16_8_ = uStack_3b0;
    auVar72._24_8_ = uStack_3a8;
    auVar8 = vfmadd231ps_fma(auVar297,auVar229,auVar72);
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar16,auVar80);
    auVar78._8_8_ = uStack_358;
    auVar78._0_8_ = local_360;
    auVar78._16_8_ = uStack_350;
    auVar78._24_8_ = uStack_348;
    auVar234 = vfmadd231ps_fma(ZEXT1632(auVar234),auVar16,auVar78);
    auVar76._8_8_ = uStack_378;
    auVar76._0_8_ = local_380;
    auVar76._16_8_ = uStack_370;
    auVar76._24_8_ = uStack_368;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar16,auVar76);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar82,auVar16);
    auVar70._4_4_ = uStack_43c;
    auVar70._0_4_ = local_440;
    auVar70._8_4_ = uStack_438;
    auVar70._12_4_ = uStack_434;
    auVar70._16_4_ = uStack_430;
    auVar70._20_4_ = uStack_42c;
    auVar70._24_4_ = uStack_428;
    auVar70._28_4_ = uStack_424;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar15,auVar70);
    auVar234 = vfmadd231ps_fma(ZEXT1632(auVar234),auVar15,auVar85);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar15,auVar84);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar83,auVar15);
    local_a00._0_4_ = auVar5._0_4_ * fVar280;
    local_a00._4_4_ = auVar5._4_4_ * fVar280;
    local_a00._8_4_ = auVar5._8_4_ * fVar280;
    local_a00._12_4_ = auVar5._12_4_ * fVar280;
    local_a00._16_4_ = fVar280 * 0.0;
    local_a00._20_4_ = fVar280 * 0.0;
    local_a00._24_4_ = fVar280 * 0.0;
    local_a00._28_4_ = 0;
    fVar279 = auVar234._0_4_ * fVar280;
    fVar201 = auVar234._4_4_ * fVar280;
    local_920._4_4_ = fVar201;
    local_920._0_4_ = fVar279;
    fVar215 = auVar234._8_4_ * fVar280;
    local_920._8_4_ = fVar215;
    fVar217 = auVar234._12_4_ * fVar280;
    local_920._12_4_ = fVar217;
    local_920._16_4_ = fVar280 * 0.0;
    local_920._20_4_ = fVar280 * 0.0;
    local_920._24_4_ = fVar280 * 0.0;
    local_920._28_4_ = (int)((ulong)uStack_188 >> 0x20);
    fVar265 = auVar7._0_4_ * fVar280;
    fVar266 = auVar7._4_4_ * fVar280;
    local_a20._4_4_ = fVar266;
    local_a20._0_4_ = fVar265;
    fVar267 = auVar7._8_4_ * fVar280;
    local_a20._8_4_ = fVar267;
    fVar272 = auVar7._12_4_ * fVar280;
    local_a20._12_4_ = fVar272;
    fVar298 = fVar280 * 0.0;
    local_a20._16_4_ = fVar298;
    fVar299 = fVar280 * 0.0;
    local_a20._20_4_ = fVar299;
    fVar300 = fVar280 * 0.0;
    local_a20._24_4_ = fVar300;
    local_a20._28_4_ = (int)((ulong)uStack_1a8 >> 0x20);
    auVar210._0_4_ = fVar280 * auVar8._0_4_;
    auVar210._4_4_ = fVar280 * auVar8._4_4_;
    auVar210._8_4_ = fVar280 * auVar8._8_4_;
    auVar210._12_4_ = fVar280 * auVar8._12_4_;
    auVar210._16_4_ = fVar280 * 0.0;
    auVar210._20_4_ = fVar280 * 0.0;
    auVar210._24_4_ = fVar280 * 0.0;
    auVar210._28_4_ = 0;
    auVar15 = vpermps_avx2(_DAT_0205d4a0,auVar111);
    local_8e0._0_32_ = vpermps_avx2(_DAT_0205d4a0,auVar197);
    _local_900 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar258));
    auVar11 = vsubps_avx(auVar15,auVar111);
    auVar146 = vsubps_avx(_local_900,ZEXT1632(auVar258));
    fVar220 = auVar146._0_4_;
    fVar124 = auVar146._4_4_;
    auVar10._4_4_ = fVar124 * local_a00._4_4_;
    auVar10._0_4_ = fVar220 * local_a00._0_4_;
    fVar125 = auVar146._8_4_;
    auVar10._8_4_ = fVar125 * local_a00._8_4_;
    fVar126 = auVar146._12_4_;
    auVar10._12_4_ = fVar126 * local_a00._12_4_;
    fVar127 = auVar146._16_4_;
    auVar10._16_4_ = fVar127 * local_a00._16_4_;
    fVar128 = auVar146._20_4_;
    auVar10._20_4_ = fVar128 * local_a00._20_4_;
    fVar129 = auVar146._24_4_;
    auVar10._24_4_ = fVar129 * local_a00._24_4_;
    auVar10._28_4_ = local_900._28_4_;
    auVar5 = vfmsub231ps_fma(auVar10,local_a20,auVar11);
    auVar12 = vsubps_avx(local_8e0._0_32_,auVar197);
    fVar301 = auVar11._0_4_;
    fVar302 = auVar11._4_4_;
    auVar18._4_4_ = fVar302 * fVar201;
    auVar18._0_4_ = fVar301 * fVar279;
    fVar303 = auVar11._8_4_;
    auVar18._8_4_ = fVar303 * fVar215;
    fVar304 = auVar11._12_4_;
    auVar18._12_4_ = fVar304 * fVar217;
    fVar305 = auVar11._16_4_;
    auVar18._16_4_ = fVar305 * fVar280 * 0.0;
    fVar306 = auVar11._20_4_;
    auVar18._20_4_ = fVar306 * fVar280 * 0.0;
    fVar307 = auVar11._24_4_;
    auVar18._24_4_ = fVar307 * fVar280 * 0.0;
    auVar18._28_4_ = auVar15._28_4_;
    auVar234 = vfmsub231ps_fma(auVar18,local_a00,auVar12);
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar234._12_4_ * auVar234._12_4_,
                                                CONCAT48(auVar234._8_4_ * auVar234._8_4_,
                                                         CONCAT44(auVar234._4_4_ * auVar234._4_4_,
                                                                  auVar234._0_4_ * auVar234._0_4_)))
                                     ),ZEXT1632(auVar5),ZEXT1632(auVar5));
    fVar157 = auVar12._0_4_;
    fVar179 = auVar12._4_4_;
    auVar19._4_4_ = fVar179 * fVar266;
    auVar19._0_4_ = fVar157 * fVar265;
    fVar180 = auVar12._8_4_;
    auVar19._8_4_ = fVar180 * fVar267;
    fVar181 = auVar12._12_4_;
    auVar19._12_4_ = fVar181 * fVar272;
    fVar256 = auVar12._16_4_;
    auVar19._16_4_ = fVar256 * fVar298;
    fVar262 = auVar12._20_4_;
    auVar19._20_4_ = fVar262 * fVar299;
    fVar263 = auVar12._24_4_;
    auVar19._24_4_ = fVar263 * fVar300;
    auVar19._28_4_ = local_8e0._28_4_;
    auVar7 = vfmsub231ps_fma(auVar19,local_920,auVar146);
    auVar236._0_4_ = fVar220 * fVar220;
    auVar236._4_4_ = fVar124 * fVar124;
    auVar236._8_4_ = fVar125 * fVar125;
    auVar236._12_4_ = fVar126 * fVar126;
    auVar236._16_4_ = fVar127 * fVar127;
    auVar236._20_4_ = fVar128 * fVar128;
    auVar236._24_4_ = fVar129 * fVar129;
    auVar236._28_4_ = 0;
    auVar234 = vfmadd231ps_fma(auVar236,auVar12,auVar12);
    auVar234 = vfmadd231ps_fma(ZEXT1632(auVar234),auVar11,auVar11);
    auVar119 = vrcpps_avx(ZEXT1632(auVar234));
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar7),ZEXT1632(auVar7));
    auVar169._8_4_ = 0x3f800000;
    auVar169._0_8_ = &DAT_3f8000003f800000;
    auVar169._12_4_ = 0x3f800000;
    auVar169._16_4_ = 0x3f800000;
    auVar169._20_4_ = 0x3f800000;
    auVar169._24_4_ = 0x3f800000;
    auVar169._28_4_ = 0x3f800000;
    auVar5 = vfnmadd213ps_fma(auVar119,ZEXT1632(auVar234),auVar169);
    auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar119,auVar119);
    local_ae0 = vpermps_avx2(_DAT_0205d4a0,local_a00);
    local_700 = vpermps_avx2(_DAT_0205d4a0,local_a20);
    auVar20._4_4_ = fVar124 * local_ae0._4_4_;
    auVar20._0_4_ = fVar220 * local_ae0._0_4_;
    auVar20._8_4_ = fVar125 * local_ae0._8_4_;
    auVar20._12_4_ = fVar126 * local_ae0._12_4_;
    auVar20._16_4_ = fVar127 * local_ae0._16_4_;
    auVar20._20_4_ = fVar128 * local_ae0._20_4_;
    auVar20._24_4_ = fVar129 * local_ae0._24_4_;
    auVar20._28_4_ = auVar119._28_4_;
    auVar8 = vfmsub231ps_fma(auVar20,local_700,auVar11);
    local_960 = vpermps_avx2(_DAT_0205d4a0,local_920);
    auVar21._4_4_ = fVar302 * local_960._4_4_;
    auVar21._0_4_ = fVar301 * local_960._0_4_;
    auVar21._8_4_ = fVar303 * local_960._8_4_;
    auVar21._12_4_ = fVar304 * local_960._12_4_;
    auVar21._16_4_ = fVar305 * local_960._16_4_;
    auVar21._20_4_ = fVar306 * local_960._20_4_;
    auVar21._24_4_ = fVar307 * local_960._24_4_;
    auVar21._28_4_ = 0;
    auVar99 = vfmsub231ps_fma(auVar21,local_ae0,auVar12);
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar99._12_4_ * auVar99._12_4_,
                                                CONCAT48(auVar99._8_4_ * auVar99._8_4_,
                                                         CONCAT44(auVar99._4_4_ * auVar99._4_4_,
                                                                  auVar99._0_4_ * auVar99._0_4_)))),
                             ZEXT1632(auVar8),ZEXT1632(auVar8));
    fVar201 = local_700._0_4_;
    auVar247._0_4_ = fVar157 * fVar201;
    fVar217 = local_700._4_4_;
    auVar247._4_4_ = fVar179 * fVar217;
    fVar243 = local_700._8_4_;
    auVar247._8_4_ = fVar180 * fVar243;
    fVar244 = local_700._12_4_;
    auVar247._12_4_ = fVar181 * fVar244;
    fVar280 = local_700._16_4_;
    auVar247._16_4_ = fVar256 * fVar280;
    fVar288 = local_700._20_4_;
    auVar247._20_4_ = fVar262 * fVar288;
    fVar95 = local_700._24_4_;
    auVar247._24_4_ = fVar263 * fVar95;
    auVar247._28_4_ = 0;
    auVar99 = vfmsub231ps_fma(auVar247,local_960,auVar146);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar99),ZEXT1632(auVar99));
    auVar119 = vmaxps_avx(ZEXT1632(CONCAT412(auVar7._12_4_ * auVar5._12_4_,
                                             CONCAT48(auVar7._8_4_ * auVar5._8_4_,
                                                      CONCAT44(auVar7._4_4_ * auVar5._4_4_,
                                                               auVar7._0_4_ * auVar5._0_4_)))),
                          ZEXT1632(CONCAT412(auVar8._12_4_ * auVar5._12_4_,
                                             CONCAT48(auVar8._8_4_ * auVar5._8_4_,
                                                      CONCAT44(auVar8._4_4_ * auVar5._4_4_,
                                                               auVar8._0_4_ * auVar5._0_4_)))));
    local_740._0_4_ = auVar210._0_4_ + auVar105._0_4_;
    local_740._4_4_ = auVar210._4_4_ + auVar105._4_4_;
    local_740._8_4_ = auVar210._8_4_ + auVar105._8_4_;
    local_740._12_4_ = auVar210._12_4_ + auVar105._12_4_;
    local_740._16_4_ = auVar210._16_4_ + 0.0;
    local_740._20_4_ = auVar210._20_4_ + 0.0;
    local_740._24_4_ = auVar210._24_4_ + 0.0;
    local_740._28_4_ = 0;
    auVar230 = vsubps_avx(ZEXT1632(auVar105),auVar210);
    local_760 = vpermps_avx2(_DAT_0205d4a0,auVar230);
    auVar229 = ZEXT1632(auVar105);
    auVar16 = vpermps_avx2(_DAT_0205d4a0,auVar229);
    auStack_770 = auVar16._16_16_;
    auVar230 = vmaxps_avx(auVar229,local_740);
    auVar6 = vmaxps_avx(local_760,auVar16);
    auVar9 = vrsqrtps_avx(ZEXT1632(auVar234));
    auVar6 = vmaxps_avx(auVar230,auVar6);
    uVar91 = auVar230._28_4_;
    fVar279 = auVar9._0_4_;
    fVar215 = auVar9._4_4_;
    fVar219 = auVar9._8_4_;
    fVar216 = auVar9._12_4_;
    fVar254 = auVar9._16_4_;
    fVar218 = auVar9._20_4_;
    fVar255 = auVar9._24_4_;
    auVar259._0_4_ = fVar279 * fVar279 * fVar279 * auVar234._0_4_ * -0.5;
    auVar259._4_4_ = fVar215 * fVar215 * fVar215 * auVar234._4_4_ * -0.5;
    auVar259._8_4_ = fVar219 * fVar219 * fVar219 * auVar234._8_4_ * -0.5;
    auVar259._12_4_ = fVar216 * fVar216 * fVar216 * auVar234._12_4_ * -0.5;
    auVar259._16_4_ = fVar254 * fVar254 * fVar254 * -0.0;
    auVar259._20_4_ = fVar218 * fVar218 * fVar218 * -0.0;
    auVar259._24_4_ = fVar255 * fVar255 * fVar255 * -0.0;
    auVar259._28_4_ = 0;
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar5 = vfmadd231ps_fma(auVar259,auVar112,auVar9);
    auVar261 = ZEXT1664(auVar5);
    fVar215 = auVar5._0_4_;
    fVar219 = auVar5._4_4_;
    auVar22._4_4_ = fVar179 * fVar219;
    auVar22._0_4_ = fVar157 * fVar215;
    fVar254 = auVar5._8_4_;
    auVar22._8_4_ = fVar180 * fVar254;
    fVar255 = auVar5._12_4_;
    auVar22._12_4_ = fVar181 * fVar255;
    auVar22._16_4_ = fVar256 * 0.0;
    auVar22._20_4_ = fVar262 * 0.0;
    auVar22._24_4_ = fVar263 * 0.0;
    auVar22._28_4_ = uVar91;
    auVar23._4_4_ = (float)local_980._4_4_ * fVar124 * fVar219;
    auVar23._0_4_ = (float)local_980._0_4_ * fVar220 * fVar215;
    auVar23._8_4_ = fStack_978 * fVar125 * fVar254;
    auVar23._12_4_ = fStack_974 * fVar126 * fVar255;
    auVar23._16_4_ = fStack_970 * fVar127 * 0.0;
    auVar23._20_4_ = fStack_96c * fVar128 * 0.0;
    auVar23._24_4_ = fStack_968 * fVar129 * 0.0;
    auVar23._28_4_ = auVar146._28_4_;
    auVar5 = vfmadd231ps_fma(auVar23,auVar22,_local_800);
    auVar287 = ZEXT864(0) << 0x20;
    auVar289 = ZEXT1632(auVar258);
    auVar230 = vsubps_avx(ZEXT832(0) << 0x20,auVar289);
    auVar278 = ZEXT3264(auVar230);
    fVar179 = auVar230._0_4_;
    fVar180 = auVar230._4_4_;
    auVar24._4_4_ = fVar180 * fVar124 * fVar219;
    auVar24._0_4_ = fVar179 * fVar220 * fVar215;
    fVar181 = auVar230._8_4_;
    auVar24._8_4_ = fVar181 * fVar125 * fVar254;
    fVar256 = auVar230._12_4_;
    auVar24._12_4_ = fVar256 * fVar126 * fVar255;
    fVar262 = auVar230._16_4_;
    auVar24._16_4_ = fVar262 * fVar127 * 0.0;
    fVar263 = auVar230._20_4_;
    auVar24._20_4_ = fVar263 * fVar128 * 0.0;
    fVar264 = auVar230._24_4_;
    auVar24._24_4_ = fVar264 * fVar129 * 0.0;
    auVar24._28_4_ = local_700._28_4_;
    auVar9 = vsubps_avx(ZEXT832(0) << 0x20,auVar197);
    auVar258 = vfmadd231ps_fma(auVar24,auVar9,auVar22);
    auVar25._4_4_ = fVar302 * fVar219;
    auVar25._0_4_ = fVar301 * fVar215;
    auVar25._8_4_ = fVar303 * fVar254;
    auVar25._12_4_ = fVar304 * fVar255;
    auVar25._16_4_ = fVar305 * 0.0;
    auVar25._20_4_ = fVar306 * 0.0;
    auVar25._24_4_ = fVar307 * 0.0;
    auVar25._28_4_ = uVar91;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar25,_local_a40);
    auVar271 = ZEXT1664(auVar5);
    auVar240 = ZEXT832(0) << 0x20;
    auVar116 = vsubps_avx(auVar240,auVar111);
    auVar258 = vfmadd231ps_fma(ZEXT1632(auVar258),auVar116,auVar25);
    auVar26._4_4_ = fVar180 * (float)local_980._4_4_;
    auVar26._0_4_ = fVar179 * (float)local_980._0_4_;
    auVar26._8_4_ = fVar181 * fStack_978;
    auVar26._12_4_ = fVar256 * fStack_974;
    auVar26._16_4_ = fVar262 * fStack_970;
    auVar26._20_4_ = fVar263 * fStack_96c;
    auVar26._24_4_ = fVar264 * fStack_968;
    auVar26._28_4_ = uVar91;
    auVar105 = vfmadd231ps_fma(auVar26,_local_800,auVar9);
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),_local_a40,auVar116);
    fVar279 = auVar258._0_4_;
    fVar127 = auVar5._0_4_;
    fVar216 = auVar258._4_4_;
    fVar128 = auVar5._4_4_;
    fVar218 = auVar258._8_4_;
    fVar129 = auVar5._8_4_;
    fVar220 = auVar258._12_4_;
    fVar157 = auVar5._12_4_;
    auVar27._28_4_ = local_800._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar157 * fVar220,
                            CONCAT48(fVar129 * fVar218,CONCAT44(fVar128 * fVar216,fVar127 * fVar279)
                                    )));
    auVar13 = vsubps_avx(ZEXT1632(auVar105),auVar27);
    auVar28._4_4_ = fVar180 * fVar180;
    auVar28._0_4_ = fVar179 * fVar179;
    auVar28._8_4_ = fVar181 * fVar181;
    auVar28._12_4_ = fVar256 * fVar256;
    auVar28._16_4_ = fVar262 * fVar262;
    auVar28._20_4_ = fVar263 * fVar263;
    auVar28._24_4_ = fVar264 * fVar264;
    auVar28._28_4_ = local_800._28_4_;
    auVar105 = vfmadd231ps_fma(auVar28,auVar9,auVar9);
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar116,auVar116);
    local_7a0 = vsubps_avx(ZEXT1632(auVar105),
                           ZEXT1632(CONCAT412(fVar220 * fVar220,
                                              CONCAT48(fVar218 * fVar218,
                                                       CONCAT44(fVar216 * fVar216,fVar279 * fVar279)
                                                      ))));
    auVar230 = vsqrtps_avx(auVar119);
    fVar279 = (auVar230._0_4_ + auVar6._0_4_) * 1.0000002;
    fVar216 = (auVar230._4_4_ + auVar6._4_4_) * 1.0000002;
    fVar218 = (auVar230._8_4_ + auVar6._8_4_) * 1.0000002;
    fVar220 = (auVar230._12_4_ + auVar6._12_4_) * 1.0000002;
    fVar124 = (auVar230._16_4_ + auVar6._16_4_) * 1.0000002;
    fVar125 = (auVar230._20_4_ + auVar6._20_4_) * 1.0000002;
    fVar126 = (auVar230._24_4_ + auVar6._24_4_) * 1.0000002;
    auVar29._4_4_ = fVar216 * fVar216;
    auVar29._0_4_ = fVar279 * fVar279;
    auVar29._8_4_ = fVar218 * fVar218;
    auVar29._12_4_ = fVar220 * fVar220;
    auVar29._16_4_ = fVar124 * fVar124;
    auVar29._20_4_ = fVar125 * fVar125;
    auVar29._24_4_ = fVar126 * fVar126;
    auVar29._28_4_ = auVar230._28_4_ + auVar6._28_4_;
    auVar170._0_4_ = auVar13._0_4_ + auVar13._0_4_;
    auVar170._4_4_ = auVar13._4_4_ + auVar13._4_4_;
    auVar170._8_4_ = auVar13._8_4_ + auVar13._8_4_;
    auVar170._12_4_ = auVar13._12_4_ + auVar13._12_4_;
    auVar170._16_4_ = auVar13._16_4_ + auVar13._16_4_;
    auVar170._20_4_ = auVar13._20_4_ + auVar13._20_4_;
    auVar170._24_4_ = auVar13._24_4_ + auVar13._24_4_;
    auVar170._28_4_ = auVar13._28_4_ + auVar13._28_4_;
    auVar6 = vsubps_avx(local_7a0,auVar29);
    auVar242 = ZEXT3264(auVar6);
    auVar270 = ZEXT1632(auVar5);
    local_a60 = ZEXT1632(CONCAT412(fVar157 * fVar157,
                                   CONCAT48(fVar129 * fVar129,
                                            CONCAT44(fVar128 * fVar128,fVar127 * fVar127))));
    auVar13 = vsubps_avx(local_240,local_a60);
    auVar30._4_4_ = auVar170._4_4_ * auVar170._4_4_;
    auVar30._0_4_ = auVar170._0_4_ * auVar170._0_4_;
    auVar30._8_4_ = auVar170._8_4_ * auVar170._8_4_;
    auVar30._12_4_ = auVar170._12_4_ * auVar170._12_4_;
    auVar30._16_4_ = auVar170._16_4_ * auVar170._16_4_;
    auVar30._20_4_ = auVar170._20_4_ * auVar170._20_4_;
    auVar30._24_4_ = auVar170._24_4_ * auVar170._24_4_;
    auVar30._28_4_ = 0x3f800002;
    fVar216 = auVar13._0_4_;
    fVar218 = auVar13._4_4_;
    fVar220 = auVar13._8_4_;
    fVar124 = auVar13._12_4_;
    fVar125 = auVar13._16_4_;
    fVar126 = auVar13._20_4_;
    fVar127 = auVar13._24_4_;
    auVar31._4_4_ = fVar218 * 4.0 * auVar6._4_4_;
    auVar31._0_4_ = fVar216 * 4.0 * auVar6._0_4_;
    auVar31._8_4_ = fVar220 * 4.0 * auVar6._8_4_;
    auVar31._12_4_ = fVar124 * 4.0 * auVar6._12_4_;
    auVar31._16_4_ = fVar125 * 4.0 * auVar6._16_4_;
    auVar31._20_4_ = fVar126 * 4.0 * auVar6._20_4_;
    auVar31._24_4_ = fVar127 * 4.0 * auVar6._24_4_;
    auVar31._28_4_ = 0x40800000;
    auVar260 = vsubps_avx(auVar30,auVar31);
    auVar119 = vcmpps_avx(auVar260,auVar240,5);
    auVar297 = ZEXT1632(auVar258);
    fVar279 = auVar13._28_4_;
    if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar119 >> 0x7f,0) == '\0') &&
          (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar119 >> 0xbf,0) == '\0') &&
        (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar119[0x1f])
    {
      auVar171._8_4_ = 0x7f800000;
      auVar171._0_8_ = 0x7f8000007f800000;
      auVar171._12_4_ = 0x7f800000;
      auVar171._16_4_ = 0x7f800000;
      auVar171._20_4_ = 0x7f800000;
      auVar171._24_4_ = 0x7f800000;
      auVar171._28_4_ = 0x7f800000;
      auVar198._8_4_ = 0xff800000;
      auVar198._0_8_ = 0xff800000ff800000;
      auVar198._12_4_ = 0xff800000;
      auVar198._16_4_ = 0xff800000;
      auVar198._20_4_ = 0xff800000;
      auVar198._24_4_ = 0xff800000;
      auVar198._28_4_ = 0xff800000;
    }
    else {
      auVar240 = vcmpps_avx(auVar260,auVar240,5);
      auVar10 = vsqrtps_avx(auVar260);
      auVar290._0_4_ = fVar216 + fVar216;
      auVar290._4_4_ = fVar218 + fVar218;
      auVar290._8_4_ = fVar220 + fVar220;
      auVar290._12_4_ = fVar124 + fVar124;
      auVar290._16_4_ = fVar125 + fVar125;
      auVar290._20_4_ = fVar126 + fVar126;
      auVar290._24_4_ = fVar127 + fVar127;
      auVar290._28_4_ = fVar279 + fVar279;
      auVar260 = vrcpps_avx(auVar290);
      auVar211._8_4_ = 0x3f800000;
      auVar211._0_8_ = &DAT_3f8000003f800000;
      auVar211._12_4_ = 0x3f800000;
      auVar211._16_4_ = 0x3f800000;
      auVar211._20_4_ = 0x3f800000;
      auVar211._24_4_ = 0x3f800000;
      auVar211._28_4_ = 0x3f800000;
      auVar5 = vfnmadd213ps_fma(auVar290,auVar260,auVar211);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar260,auVar260);
      auVar282._0_4_ = (uint)auVar170._0_4_ ^ local_5e0;
      auVar282._4_4_ = (uint)auVar170._4_4_ ^ uStack_5dc;
      auVar282._8_4_ = (uint)auVar170._8_4_ ^ uStack_5d8;
      auVar282._12_4_ = (uint)auVar170._12_4_ ^ uStack_5d4;
      auVar282._16_4_ = (uint)auVar170._16_4_ ^ (uint)fStack_5d0;
      auVar282._20_4_ = (uint)auVar170._20_4_ ^ (uint)fStack_5cc;
      auVar282._24_4_ = (uint)auVar170._24_4_ ^ (uint)fStack_5c8;
      auVar282._28_4_ = (uint)auVar170._28_4_ ^ uStack_5c4;
      auVar260 = vsubps_avx(auVar282,auVar10);
      auVar32._4_4_ = auVar260._4_4_ * auVar5._4_4_;
      auVar32._0_4_ = auVar260._0_4_ * auVar5._0_4_;
      auVar32._8_4_ = auVar260._8_4_ * auVar5._8_4_;
      auVar32._12_4_ = auVar260._12_4_ * auVar5._12_4_;
      auVar32._16_4_ = auVar260._16_4_ * 0.0;
      auVar32._20_4_ = auVar260._20_4_ * 0.0;
      auVar32._24_4_ = auVar260._24_4_ * 0.0;
      auVar32._28_4_ = auVar260._28_4_;
      auVar260 = vsubps_avx(auVar10,auVar170);
      auVar33._4_4_ = auVar5._4_4_ * auVar260._4_4_;
      auVar33._0_4_ = auVar5._0_4_ * auVar260._0_4_;
      auVar33._8_4_ = auVar5._8_4_ * auVar260._8_4_;
      auVar33._12_4_ = auVar5._12_4_ * auVar260._12_4_;
      auVar33._16_4_ = auVar260._16_4_ * 0.0;
      auVar33._20_4_ = auVar260._20_4_ * 0.0;
      auVar33._24_4_ = auVar260._24_4_ * 0.0;
      auVar33._28_4_ = auVar260._28_4_;
      auVar5 = vfmadd213ps_fma(auVar270,auVar32,auVar297);
      local_4e0 = ZEXT1632(CONCAT412(fVar255 * auVar5._12_4_,
                                     CONCAT48(fVar254 * auVar5._8_4_,
                                              CONCAT44(fVar219 * auVar5._4_4_,fVar215 * auVar5._0_4_
                                                      ))));
      auVar5 = vfmadd213ps_fma(auVar270,auVar33,auVar297);
      local_500 = ZEXT1632(CONCAT412(fVar255 * auVar5._12_4_,
                                     CONCAT48(fVar254 * auVar5._8_4_,
                                              CONCAT44(fVar219 * auVar5._4_4_,fVar215 * auVar5._0_4_
                                                      ))));
      auVar143._8_4_ = 0x7f800000;
      auVar143._0_8_ = 0x7f8000007f800000;
      auVar143._12_4_ = 0x7f800000;
      auVar143._16_4_ = 0x7f800000;
      auVar143._20_4_ = 0x7f800000;
      auVar143._24_4_ = 0x7f800000;
      auVar143._28_4_ = 0x7f800000;
      auVar171 = vblendvps_avx(auVar143,auVar32,auVar240);
      auVar64._4_4_ = uStack_81c;
      auVar64._0_4_ = local_820;
      auVar64._8_4_ = uStack_818;
      auVar64._12_4_ = uStack_814;
      auVar64._16_4_ = uStack_810;
      auVar64._20_4_ = uStack_80c;
      auVar64._24_4_ = uStack_808;
      auVar64._28_4_ = uStack_804;
      auVar260 = vandps_avx(local_a60,auVar64);
      auVar260 = vmaxps_avx(local_4a0,auVar260);
      auVar14._4_4_ = auVar260._4_4_ * 1.9073486e-06;
      auVar14._0_4_ = auVar260._0_4_ * 1.9073486e-06;
      auVar14._8_4_ = auVar260._8_4_ * 1.9073486e-06;
      auVar14._12_4_ = auVar260._12_4_ * 1.9073486e-06;
      auVar14._16_4_ = auVar260._16_4_ * 1.9073486e-06;
      auVar14._20_4_ = auVar260._20_4_ * 1.9073486e-06;
      auVar14._24_4_ = auVar260._24_4_ * 1.9073486e-06;
      auVar14._28_4_ = auVar260._28_4_;
      auVar260 = vandps_avx(auVar13,auVar64);
      auVar260 = vcmpps_avx(auVar260,auVar14,1);
      auVar144._8_4_ = 0xff800000;
      auVar144._0_8_ = 0xff800000ff800000;
      auVar144._12_4_ = 0xff800000;
      auVar144._16_4_ = 0xff800000;
      auVar144._20_4_ = 0xff800000;
      auVar144._24_4_ = 0xff800000;
      auVar144._28_4_ = 0xff800000;
      auVar198 = vblendvps_avx(auVar144,auVar33,auVar240);
      auVar10 = auVar240 & auVar260;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar119 = vandps_avx(auVar260,auVar240);
        auVar260 = vcmpps_avx(auVar6,_DAT_02020f00,2);
        auVar242 = ZEXT3264(auVar260);
        auVar122._8_4_ = 0xff800000;
        auVar122._0_8_ = 0xff800000ff800000;
        auVar122._12_4_ = 0xff800000;
        auVar122._16_4_ = 0xff800000;
        auVar122._20_4_ = 0xff800000;
        auVar122._24_4_ = 0xff800000;
        auVar122._28_4_ = 0xff800000;
        auVar156._8_4_ = 0x7f800000;
        auVar156._0_8_ = 0x7f8000007f800000;
        auVar156._12_4_ = 0x7f800000;
        auVar156._16_4_ = 0x7f800000;
        auVar156._20_4_ = 0x7f800000;
        auVar156._24_4_ = 0x7f800000;
        auVar156._28_4_ = 0x7f800000;
        auVar6 = vblendvps_avx(auVar156,auVar122,auVar260);
        auVar5 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
        auVar14 = vpmovsxwd_avx2(auVar5);
        auVar171 = vblendvps_avx(auVar171,auVar6,auVar14);
        auVar6 = vblendvps_avx(auVar122,auVar156,auVar260);
        auVar198 = vblendvps_avx(auVar198,auVar6,auVar14);
        auVar213._0_8_ = auVar119._0_8_ ^ 0xffffffffffffffff;
        auVar213._8_4_ = auVar119._8_4_ ^ 0xffffffff;
        auVar213._12_4_ = auVar119._12_4_ ^ 0xffffffff;
        auVar213._16_4_ = auVar119._16_4_ ^ 0xffffffff;
        auVar213._20_4_ = auVar119._20_4_ ^ 0xffffffff;
        auVar213._24_4_ = auVar119._24_4_ ^ 0xffffffff;
        auVar213._28_4_ = auVar119._28_4_ ^ 0xffffffff;
        auVar119 = vorps_avx(auVar260,auVar213);
        auVar119 = vandps_avx(auVar240,auVar119);
      }
      auVar287 = ZEXT3264(auVar14);
    }
    auVar214 = ZEXT3264(local_280);
    auVar6 = local_280 & auVar119;
    if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar6 >> 0x7f,0) != '\0') ||
          (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar6 >> 0xbf,0) != '\0') ||
        (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar6[0x1f] < '\0') {
      fVar128 = *(float *)(ray + k * 4 + 0x80) - (float)local_8b0._0_4_;
      auVar239._4_4_ = fVar128;
      auVar239._0_4_ = fVar128;
      auVar239._8_4_ = fVar128;
      auVar239._12_4_ = fVar128;
      auVar239._16_4_ = fVar128;
      auVar239._20_4_ = fVar128;
      auVar239._24_4_ = fVar128;
      auVar239._28_4_ = fVar128;
      auVar260 = vminps_avx(auVar239,auVar198);
      auVar34._4_4_ = fVar266 * fVar180;
      auVar34._0_4_ = fVar265 * fVar179;
      auVar34._8_4_ = fVar267 * fVar181;
      auVar34._12_4_ = fVar272 * fVar256;
      auVar34._16_4_ = fVar298 * fVar262;
      auVar34._20_4_ = fVar299 * fVar263;
      auVar34._24_4_ = fVar300 * fVar264;
      auVar34._28_4_ = fVar128;
      auVar5 = vfmadd213ps_fma(auVar9,local_920,auVar34);
      auVar258 = vfmadd213ps_fma(auVar116,local_a00,ZEXT1632(auVar5));
      auVar35._4_4_ = fVar266 * (float)local_980._4_4_;
      auVar35._0_4_ = fVar265 * (float)local_980._0_4_;
      auVar35._8_4_ = fVar267 * fStack_978;
      auVar35._12_4_ = fVar272 * fStack_974;
      auVar35._16_4_ = fVar298 * fStack_970;
      auVar35._20_4_ = fVar299 * fStack_96c;
      auVar35._24_4_ = fVar300 * fStack_968;
      auVar35._28_4_ = fVar128;
      auVar5 = vfmadd231ps_fma(auVar35,_local_800,local_920);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_a40,local_a00);
      auVar65._4_4_ = uStack_81c;
      auVar65._0_4_ = local_820;
      auVar65._8_4_ = uStack_818;
      auVar65._12_4_ = uStack_814;
      auVar65._16_4_ = uStack_810;
      auVar65._20_4_ = uStack_80c;
      auVar65._24_4_ = uStack_808;
      auVar65._28_4_ = uStack_804;
      auVar6 = vandps_avx(ZEXT1632(auVar105),auVar65);
      auVar145._8_4_ = 0x219392ef;
      auVar145._0_8_ = 0x219392ef219392ef;
      auVar145._12_4_ = 0x219392ef;
      auVar145._16_4_ = 0x219392ef;
      auVar145._20_4_ = 0x219392ef;
      auVar145._24_4_ = 0x219392ef;
      auVar145._28_4_ = 0x219392ef;
      auVar9 = vcmpps_avx(auVar6,auVar145,1);
      auVar6 = vrcpps_avx(ZEXT1632(auVar105));
      auVar291._8_4_ = 0x3f800000;
      auVar291._0_8_ = &DAT_3f8000003f800000;
      auVar291._12_4_ = 0x3f800000;
      auVar291._16_4_ = 0x3f800000;
      auVar291._20_4_ = 0x3f800000;
      auVar291._24_4_ = 0x3f800000;
      auVar291._28_4_ = 0x3f800000;
      auVar240 = ZEXT1632(auVar105);
      auVar5 = vfnmadd213ps_fma(auVar6,auVar240,auVar291);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar6,auVar6);
      auVar277._0_4_ = auVar105._0_4_ ^ local_5e0;
      auVar277._4_4_ = auVar105._4_4_ ^ uStack_5dc;
      auVar277._8_4_ = auVar105._8_4_ ^ uStack_5d8;
      auVar277._12_4_ = auVar105._12_4_ ^ uStack_5d4;
      auVar277._16_4_ = fStack_5d0;
      auVar277._20_4_ = fStack_5cc;
      auVar277._24_4_ = fStack_5c8;
      auVar277._28_4_ = uStack_5c4;
      auVar283._0_4_ = auVar5._0_4_ * (float)(auVar258._0_4_ ^ local_5e0);
      auVar283._4_4_ = auVar5._4_4_ * (float)(auVar258._4_4_ ^ uStack_5dc);
      auVar283._8_4_ = auVar5._8_4_ * (float)(auVar258._8_4_ ^ uStack_5d8);
      auVar283._12_4_ = auVar5._12_4_ * (float)(auVar258._12_4_ ^ uStack_5d4);
      auVar283._16_4_ = fStack_5d0 * 0.0;
      auVar283._20_4_ = fStack_5cc * 0.0;
      auVar283._24_4_ = fStack_5c8 * 0.0;
      auVar283._28_4_ = 0;
      auVar6 = vcmpps_avx(auVar240,auVar277,1);
      auVar6 = vorps_avx(auVar9,auVar6);
      auVar292._8_4_ = 0xff800000;
      auVar292._0_8_ = 0xff800000ff800000;
      auVar292._12_4_ = 0xff800000;
      auVar292._16_4_ = 0xff800000;
      auVar292._20_4_ = 0xff800000;
      auVar292._24_4_ = 0xff800000;
      auVar292._28_4_ = 0xff800000;
      auVar6 = vblendvps_avx(auVar283,auVar292,auVar6);
      auVar79._4_4_ = fStack_29c;
      auVar79._0_4_ = local_2a0;
      auVar79._8_4_ = fStack_298;
      auVar79._12_4_ = fStack_294;
      auVar79._16_4_ = fStack_290;
      auVar79._20_4_ = fStack_28c;
      auVar79._24_4_ = fStack_288;
      auVar79._28_4_ = fStack_284;
      auVar116 = vmaxps_avx(auVar79,auVar171);
      auVar116 = vmaxps_avx(auVar116,auVar6);
      auVar6 = vcmpps_avx(auVar240,auVar277,6);
      auVar6 = vorps_avx(auVar9,auVar6);
      auVar248._8_4_ = 0x7f800000;
      auVar248._0_8_ = 0x7f8000007f800000;
      auVar248._12_4_ = 0x7f800000;
      auVar248._16_4_ = 0x7f800000;
      auVar248._20_4_ = 0x7f800000;
      auVar248._24_4_ = 0x7f800000;
      auVar248._28_4_ = 0x7f800000;
      auVar6 = vblendvps_avx(auVar283,auVar248,auVar6);
      auVar260 = vminps_avx(auVar260,auVar6);
      auVar6 = vsubps_avx(ZEXT832(0) << 0x20,local_8e0._0_32_);
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,_local_900);
      auVar36._4_4_ = auVar9._4_4_ * fVar217;
      auVar36._0_4_ = auVar9._0_4_ * fVar201;
      auVar36._8_4_ = auVar9._8_4_ * fVar243;
      auVar36._12_4_ = auVar9._12_4_ * fVar244;
      auVar36._16_4_ = auVar9._16_4_ * fVar280;
      auVar36._20_4_ = auVar9._20_4_ * fVar288;
      auVar36._24_4_ = auVar9._24_4_ * fVar95;
      auVar36._28_4_ = auVar9._28_4_;
      auVar5 = vfnmsub231ps_fma(auVar36,local_960,auVar6);
      auVar6 = vsubps_avx(ZEXT832(0) << 0x20,auVar15);
      auVar258 = vfnmadd231ps_fma(ZEXT1632(auVar5),local_ae0,auVar6);
      auVar37._4_4_ = fVar217 * (float)local_980._4_4_;
      auVar37._0_4_ = fVar201 * (float)local_980._0_4_;
      auVar37._8_4_ = fVar243 * fStack_978;
      auVar37._12_4_ = fVar244 * fStack_974;
      auVar37._16_4_ = fVar280 * fStack_970;
      auVar37._20_4_ = fVar288 * fStack_96c;
      auVar37._24_4_ = fVar95 * fStack_968;
      auVar37._28_4_ = auVar6._28_4_;
      auVar5 = vfnmsub231ps_fma(auVar37,local_960,_local_800);
      auVar105 = vfnmadd231ps_fma(ZEXT1632(auVar5),_local_a40,local_ae0);
      auVar242 = ZEXT1664(auVar105);
      auVar172._8_4_ = 0x3f800000;
      auVar172._0_8_ = &DAT_3f8000003f800000;
      auVar172._12_4_ = 0x3f800000;
      auVar172._16_4_ = 0x3f800000;
      auVar172._20_4_ = 0x3f800000;
      auVar172._24_4_ = 0x3f800000;
      auVar172._28_4_ = 0x3f800000;
      auVar6 = vandps_avx(ZEXT1632(auVar105),auVar65);
      auVar15 = vrcpps_avx(ZEXT1632(auVar105));
      auVar113._8_4_ = 0x219392ef;
      auVar113._0_8_ = 0x219392ef219392ef;
      auVar113._12_4_ = 0x219392ef;
      auVar113._16_4_ = 0x219392ef;
      auVar113._20_4_ = 0x219392ef;
      auVar113._24_4_ = 0x219392ef;
      auVar113._28_4_ = 0x219392ef;
      auVar9 = vcmpps_avx(auVar6,auVar113,1);
      auVar278 = ZEXT3264(auVar9);
      auVar240 = ZEXT1632(auVar105);
      auVar5 = vfnmadd213ps_fma(auVar15,auVar240,auVar172);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar15,auVar15);
      auVar284._0_4_ = auVar105._0_4_ ^ local_5e0;
      auVar284._4_4_ = auVar105._4_4_ ^ uStack_5dc;
      auVar284._8_4_ = auVar105._8_4_ ^ uStack_5d8;
      auVar284._12_4_ = auVar105._12_4_ ^ uStack_5d4;
      auVar284._16_4_ = fStack_5d0;
      auVar284._20_4_ = fStack_5cc;
      auVar284._24_4_ = fStack_5c8;
      auVar284._28_4_ = uStack_5c4;
      auVar287 = ZEXT3264(auVar284);
      auVar38._4_4_ = auVar5._4_4_ * (float)(auVar258._4_4_ ^ uStack_5dc);
      auVar38._0_4_ = auVar5._0_4_ * (float)(auVar258._0_4_ ^ local_5e0);
      auVar38._8_4_ = auVar5._8_4_ * (float)(auVar258._8_4_ ^ uStack_5d8);
      auVar38._12_4_ = auVar5._12_4_ * (float)(auVar258._12_4_ ^ uStack_5d4);
      auVar38._16_4_ = fStack_5d0 * 0.0;
      auVar38._20_4_ = fStack_5cc * 0.0;
      auVar38._24_4_ = fStack_5c8 * 0.0;
      auVar38._28_4_ = uStack_5c4;
      auVar6 = vcmpps_avx(auVar240,auVar284,1);
      auVar6 = vorps_avx(auVar9,auVar6);
      auVar114._8_4_ = 0xff800000;
      auVar114._0_8_ = 0xff800000ff800000;
      auVar114._12_4_ = 0xff800000;
      auVar114._16_4_ = 0xff800000;
      auVar114._20_4_ = 0xff800000;
      auVar114._24_4_ = 0xff800000;
      auVar114._28_4_ = 0xff800000;
      auVar6 = vblendvps_avx(auVar38,auVar114,auVar6);
      _local_7e0 = vmaxps_avx(auVar116,auVar6);
      auVar6 = vcmpps_avx(auVar240,auVar284,6);
      auVar6 = vorps_avx(auVar9,auVar6);
      auVar115._8_4_ = 0x7f800000;
      auVar115._0_8_ = 0x7f8000007f800000;
      auVar115._12_4_ = 0x7f800000;
      auVar115._16_4_ = 0x7f800000;
      auVar115._20_4_ = 0x7f800000;
      auVar115._24_4_ = 0x7f800000;
      auVar115._28_4_ = 0x7f800000;
      auVar6 = vblendvps_avx(auVar38,auVar115,auVar6);
      auVar119 = vandps_avx(auVar119,local_280);
      auVar214 = ZEXT3264(auVar119);
      local_2e0 = vminps_avx(auVar260,auVar6);
      auVar6 = vcmpps_avx(_local_7e0,local_2e0,2);
      auVar9 = auVar119 & auVar6;
      if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0x7f,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0xbf,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0')
      {
        auVar9 = vminps_avx(local_4e0,auVar172);
        auVar53 = ZEXT412(0);
        auVar287 = ZEXT1264(auVar53) << 0x20;
        auVar9 = vmaxps_avx(auVar9,ZEXT1232(auVar53) << 0x20);
        auVar116 = vminps_avx(local_500,auVar172);
        auVar116 = vmaxps_avx(auVar116,ZEXT1232(auVar53) << 0x20);
        auVar39._4_4_ = (auVar9._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar9._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar9._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar9._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar9._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar9._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar9._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar9._28_4_ + 7.0;
        auVar5 = vfmadd213ps_fma(auVar39,local_720,local_9a0);
        auVar40._4_4_ = (auVar116._4_4_ + 1.0) * 0.125;
        auVar40._0_4_ = (auVar116._0_4_ + 0.0) * 0.125;
        auVar40._8_4_ = (auVar116._8_4_ + 2.0) * 0.125;
        auVar40._12_4_ = (auVar116._12_4_ + 3.0) * 0.125;
        auVar40._16_4_ = (auVar116._16_4_ + 4.0) * 0.125;
        auVar40._20_4_ = (auVar116._20_4_ + 5.0) * 0.125;
        auVar40._24_4_ = (auVar116._24_4_ + 6.0) * 0.125;
        auVar40._28_4_ = auVar116._28_4_ + 7.0;
        auVar258 = vfmadd213ps_fma(auVar40,local_720,local_9a0);
        auVar9 = vminps_avx(auVar229,local_740);
        auVar116 = vminps_avx(local_760,auVar16);
        auVar9 = vminps_avx(auVar9,auVar116);
        auVar230 = vsubps_avx(auVar9,auVar230);
        auVar119 = vandps_avx(auVar6,auVar119);
        local_4e0 = ZEXT1632(auVar5);
        local_500 = ZEXT1632(auVar258);
        auVar41._4_4_ = auVar230._4_4_ * 0.99999976;
        auVar41._0_4_ = auVar230._0_4_ * 0.99999976;
        auVar41._8_4_ = auVar230._8_4_ * 0.99999976;
        auVar41._12_4_ = auVar230._12_4_ * 0.99999976;
        auVar41._16_4_ = auVar230._16_4_ * 0.99999976;
        auVar41._20_4_ = auVar230._20_4_ * 0.99999976;
        auVar41._24_4_ = auVar230._24_4_ * 0.99999976;
        auVar41._28_4_ = auVar230._28_4_;
        auVar230 = vmaxps_avx(ZEXT832(0) << 0x20,auVar41);
        auVar42._4_4_ = auVar230._4_4_ * auVar230._4_4_;
        auVar42._0_4_ = auVar230._0_4_ * auVar230._0_4_;
        auVar42._8_4_ = auVar230._8_4_ * auVar230._8_4_;
        auVar42._12_4_ = auVar230._12_4_ * auVar230._12_4_;
        auVar42._16_4_ = auVar230._16_4_ * auVar230._16_4_;
        auVar42._20_4_ = auVar230._20_4_ * auVar230._20_4_;
        auVar42._24_4_ = auVar230._24_4_ * auVar230._24_4_;
        auVar42._28_4_ = auVar230._28_4_;
        auVar6 = vsubps_avx(local_7a0,auVar42);
        auVar43._4_4_ = auVar6._4_4_ * fVar218 * 4.0;
        auVar43._0_4_ = auVar6._0_4_ * fVar216 * 4.0;
        auVar43._8_4_ = auVar6._8_4_ * fVar220 * 4.0;
        auVar43._12_4_ = auVar6._12_4_ * fVar124 * 4.0;
        auVar43._16_4_ = auVar6._16_4_ * fVar125 * 4.0;
        auVar43._20_4_ = auVar6._20_4_ * fVar126 * 4.0;
        auVar43._24_4_ = auVar6._24_4_ * fVar127 * 4.0;
        auVar43._28_4_ = auVar230._28_4_;
        auVar9 = vsubps_avx(auVar30,auVar43);
        auVar278 = ZEXT3264(auVar9);
        auVar116 = SUB6432(ZEXT864(0),0) << 0x20;
        local_860 = ZEXT832(0) << 0x20;
        auVar230 = vcmpps_avx(auVar9,ZEXT1232(auVar53) << 0x20,5);
        if ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar230 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar230 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar230 >> 0x7f,0) == '\0') &&
              (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar230 >> 0xbf,0) == '\0') &&
            (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar230[0x1f]) {
          _local_880 = ZEXT832(0) << 0x20;
          auVar146 = ZEXT832(0) << 0x20;
          auVar178 = ZEXT864(0) << 0x20;
          auVar241._8_4_ = 0x7f800000;
          auVar241._0_8_ = 0x7f8000007f800000;
          auVar241._12_4_ = 0x7f800000;
          auVar241._16_4_ = 0x7f800000;
          auVar241._20_4_ = 0x7f800000;
          auVar241._24_4_ = 0x7f800000;
          auVar241._28_4_ = 0x7f800000;
          auVar249._8_4_ = 0xff800000;
          auVar249._0_8_ = 0xff800000ff800000;
          auVar249._12_4_ = 0xff800000;
          auVar249._16_4_ = 0xff800000;
          auVar249._20_4_ = 0xff800000;
          auVar249._24_4_ = 0xff800000;
          auVar249._28_4_ = 0xff800000;
          _local_840 = local_860;
        }
        else {
          auVar260 = vsqrtps_avx(auVar9);
          auVar250._0_4_ = fVar216 + fVar216;
          auVar250._4_4_ = fVar218 + fVar218;
          auVar250._8_4_ = fVar220 + fVar220;
          auVar250._12_4_ = fVar124 + fVar124;
          auVar250._16_4_ = fVar125 + fVar125;
          auVar250._20_4_ = fVar126 + fVar126;
          auVar250._24_4_ = fVar127 + fVar127;
          auVar250._28_4_ = fVar279 + fVar279;
          auVar116 = vrcpps_avx(auVar250);
          auVar5 = vfnmadd213ps_fma(auVar250,auVar116,auVar172);
          auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar116,auVar116);
          auVar285._0_4_ = (uint)auVar170._0_4_ ^ local_5e0;
          auVar285._4_4_ = (uint)auVar170._4_4_ ^ uStack_5dc;
          auVar285._8_4_ = (uint)auVar170._8_4_ ^ uStack_5d8;
          auVar285._12_4_ = (uint)auVar170._12_4_ ^ uStack_5d4;
          auVar285._16_4_ = (uint)auVar170._16_4_ ^ (uint)fStack_5d0;
          auVar285._20_4_ = (uint)auVar170._20_4_ ^ (uint)fStack_5cc;
          auVar285._24_4_ = (uint)auVar170._24_4_ ^ (uint)fStack_5c8;
          auVar285._28_4_ = (uint)auVar170._28_4_ ^ uStack_5c4;
          auVar116 = vsubps_avx(auVar285,auVar260);
          auVar15 = vsubps_avx(auVar260,auVar170);
          fVar201 = auVar116._0_4_ * auVar5._0_4_;
          fVar217 = auVar116._4_4_ * auVar5._4_4_;
          auVar44._4_4_ = fVar217;
          auVar44._0_4_ = fVar201;
          fVar216 = auVar116._8_4_ * auVar5._8_4_;
          auVar44._8_4_ = fVar216;
          fVar243 = auVar116._12_4_ * auVar5._12_4_;
          auVar44._12_4_ = fVar243;
          fVar218 = auVar116._16_4_ * 0.0;
          auVar44._16_4_ = fVar218;
          fVar244 = auVar116._20_4_ * 0.0;
          auVar44._20_4_ = fVar244;
          fVar220 = auVar116._24_4_ * 0.0;
          auVar44._24_4_ = fVar220;
          auVar44._28_4_ = auVar260._28_4_;
          fVar280 = auVar15._0_4_ * auVar5._0_4_;
          fVar288 = auVar15._4_4_ * auVar5._4_4_;
          auVar45._4_4_ = fVar288;
          auVar45._0_4_ = fVar280;
          fVar95 = auVar15._8_4_ * auVar5._8_4_;
          auVar45._8_4_ = fVar95;
          fVar124 = auVar15._12_4_ * auVar5._12_4_;
          auVar45._12_4_ = fVar124;
          fVar125 = auVar15._16_4_ * 0.0;
          auVar45._16_4_ = fVar125;
          fVar126 = auVar15._20_4_ * 0.0;
          auVar45._20_4_ = fVar126;
          fVar127 = auVar15._24_4_ * 0.0;
          auVar45._24_4_ = fVar127;
          auVar45._28_4_ = auVar116._28_4_;
          auVar287 = ZEXT3264(auVar45);
          auVar5 = vfmadd213ps_fma(auVar270,auVar44,auVar297);
          auVar258 = vfmadd213ps_fma(auVar270,auVar45,auVar297);
          auVar116 = ZEXT1632(CONCAT412(fVar255 * auVar5._12_4_,
                                        CONCAT48(fVar254 * auVar5._8_4_,
                                                 CONCAT44(fVar219 * auVar5._4_4_,
                                                          fVar215 * auVar5._0_4_))));
          auVar260 = ZEXT1632(CONCAT412(fVar255 * auVar258._12_4_,
                                        CONCAT48(fVar254 * auVar258._8_4_,
                                                 CONCAT44(fVar219 * auVar258._4_4_,
                                                          fVar215 * auVar258._0_4_))));
          auVar5 = vfmadd213ps_fma(auVar11,auVar116,auVar111);
          auVar258 = vfmadd213ps_fma(auVar11,auVar260,auVar111);
          auVar105 = vfmadd213ps_fma(auVar12,auVar116,auVar197);
          auVar234 = vfmadd213ps_fma(auVar12,auVar260,auVar197);
          auVar7 = vfmadd213ps_fma(auVar116,auVar146,auVar289);
          auVar8 = vfmadd213ps_fma(auVar146,auVar260,auVar289);
          auVar46._4_4_ = (float)local_a40._4_4_ * fVar217;
          auVar46._0_4_ = (float)local_a40._0_4_ * fVar201;
          auVar46._8_4_ = fStack_a38 * fVar216;
          auVar46._12_4_ = fStack_a34 * fVar243;
          auVar46._16_4_ = fStack_a30 * fVar218;
          auVar46._20_4_ = fStack_a2c * fVar244;
          auVar46._24_4_ = fStack_a28 * fVar220;
          auVar46._28_4_ = 0;
          auVar116 = vsubps_avx(auVar46,ZEXT1632(auVar5));
          auVar47._4_4_ = (float)local_800._4_4_ * fVar217;
          auVar47._0_4_ = (float)local_800._0_4_ * fVar201;
          auVar47._8_4_ = fStack_7f8 * fVar216;
          auVar47._12_4_ = fStack_7f4 * fVar243;
          auVar47._16_4_ = fStack_7f0 * fVar218;
          auVar47._20_4_ = fStack_7ec * fVar244;
          auVar47._24_4_ = fStack_7e8 * fVar220;
          auVar47._28_4_ = fVar279;
          auVar146 = vsubps_avx(auVar47,ZEXT1632(auVar105));
          auVar173._0_4_ = (float)local_980._0_4_ * fVar201;
          auVar173._4_4_ = (float)local_980._4_4_ * fVar217;
          auVar173._8_4_ = fStack_978 * fVar216;
          auVar173._12_4_ = fStack_974 * fVar243;
          auVar173._16_4_ = fStack_970 * fVar218;
          auVar173._20_4_ = fStack_96c * fVar244;
          auVar173._24_4_ = fStack_968 * fVar220;
          auVar173._28_4_ = 0;
          auVar11 = vsubps_avx(auVar173,ZEXT1632(auVar7));
          auVar178 = ZEXT3264(auVar11);
          auVar251._0_4_ = (float)local_a40._0_4_ * fVar280;
          auVar251._4_4_ = (float)local_a40._4_4_ * fVar288;
          auVar251._8_4_ = fStack_a38 * fVar95;
          auVar251._12_4_ = fStack_a34 * fVar124;
          auVar251._16_4_ = fStack_a30 * fVar125;
          auVar251._20_4_ = fStack_a2c * fVar126;
          auVar251._24_4_ = fStack_a28 * fVar127;
          auVar251._28_4_ = 0;
          _local_840 = vsubps_avx(auVar251,ZEXT1632(auVar258));
          auVar48._4_4_ = (float)local_800._4_4_ * fVar288;
          auVar48._0_4_ = (float)local_800._0_4_ * fVar280;
          auVar48._8_4_ = fStack_7f8 * fVar95;
          auVar48._12_4_ = fStack_7f4 * fVar124;
          auVar48._16_4_ = fStack_7f0 * fVar125;
          auVar48._20_4_ = fStack_7ec * fVar126;
          auVar48._24_4_ = fStack_7e8 * fVar127;
          auVar48._28_4_ = local_840._28_4_;
          local_860 = vsubps_avx(auVar48,ZEXT1632(auVar234));
          auVar49._4_4_ = (float)local_980._4_4_ * fVar288;
          auVar49._0_4_ = (float)local_980._0_4_ * fVar280;
          auVar49._8_4_ = fStack_978 * fVar95;
          auVar49._12_4_ = fStack_974 * fVar124;
          auVar49._16_4_ = fStack_970 * fVar125;
          auVar49._20_4_ = fStack_96c * fVar126;
          auVar49._24_4_ = fStack_968 * fVar127;
          auVar49._28_4_ = local_860._28_4_;
          _local_880 = vsubps_avx(auVar49,ZEXT1632(auVar8));
          auVar11 = vcmpps_avx(auVar9,_DAT_02020f00,5);
          auVar252._8_4_ = 0x7f800000;
          auVar252._0_8_ = 0x7f8000007f800000;
          auVar252._12_4_ = 0x7f800000;
          auVar252._16_4_ = 0x7f800000;
          auVar252._20_4_ = 0x7f800000;
          auVar252._24_4_ = 0x7f800000;
          auVar252._28_4_ = 0x7f800000;
          auVar241 = vblendvps_avx(auVar252,auVar44,auVar11);
          auVar66._4_4_ = uStack_81c;
          auVar66._0_4_ = local_820;
          auVar66._8_4_ = uStack_818;
          auVar66._12_4_ = uStack_814;
          auVar66._16_4_ = uStack_810;
          auVar66._20_4_ = uStack_80c;
          auVar66._24_4_ = uStack_808;
          auVar66._28_4_ = uStack_804;
          auVar9 = vandps_avx(auVar66,local_a60);
          auVar9 = vmaxps_avx(local_4a0,auVar9);
          auVar278 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar50._4_4_ = auVar9._4_4_ * 1.9073486e-06;
          auVar50._0_4_ = auVar9._0_4_ * 1.9073486e-06;
          auVar50._8_4_ = auVar9._8_4_ * 1.9073486e-06;
          auVar50._12_4_ = auVar9._12_4_ * 1.9073486e-06;
          auVar50._16_4_ = auVar9._16_4_ * 1.9073486e-06;
          auVar50._20_4_ = auVar9._20_4_ * 1.9073486e-06;
          auVar50._24_4_ = auVar9._24_4_ * 1.9073486e-06;
          auVar50._28_4_ = auVar9._28_4_;
          auVar9 = vandps_avx(auVar66,auVar13);
          auVar9 = vcmpps_avx(auVar9,auVar50,1);
          auVar271 = ZEXT3264(auVar9);
          auVar253._8_4_ = 0xff800000;
          auVar253._0_8_ = 0xff800000ff800000;
          auVar253._12_4_ = 0xff800000;
          auVar253._16_4_ = 0xff800000;
          auVar253._20_4_ = 0xff800000;
          auVar253._24_4_ = 0xff800000;
          auVar253._28_4_ = 0xff800000;
          auVar249 = vblendvps_avx(auVar253,auVar45,auVar11);
          auVar12 = auVar11 & auVar9;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0x7f,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0xbf,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar12[0x1f] < '\0') {
            auVar230 = vandps_avx(auVar9,auVar11);
            auVar9 = vcmpps_avx(auVar6,ZEXT832(0) << 0x20,2);
            auVar286._8_4_ = 0xff800000;
            auVar286._0_8_ = 0xff800000ff800000;
            auVar286._12_4_ = 0xff800000;
            auVar286._16_4_ = 0xff800000;
            auVar286._20_4_ = 0xff800000;
            auVar286._24_4_ = 0xff800000;
            auVar286._28_4_ = 0xff800000;
            auVar287 = ZEXT3264(auVar286);
            auVar293._8_4_ = 0x7f800000;
            auVar293._0_8_ = 0x7f8000007f800000;
            auVar293._12_4_ = 0x7f800000;
            auVar293._16_4_ = 0x7f800000;
            auVar293._20_4_ = 0x7f800000;
            auVar293._24_4_ = 0x7f800000;
            auVar293._28_4_ = 0x7f800000;
            auVar6 = vblendvps_avx(auVar293,auVar286,auVar9);
            auVar5 = vpackssdw_avx(auVar230._0_16_,auVar230._16_16_);
            auVar12 = vpmovsxwd_avx2(auVar5);
            auVar271 = ZEXT3264(auVar12);
            auVar241 = vblendvps_avx(auVar241,auVar6,auVar12);
            auVar6 = vblendvps_avx(auVar286,auVar293,auVar9);
            auVar278 = ZEXT3264(auVar6);
            auVar249 = vblendvps_avx(auVar249,auVar6,auVar12);
            auVar231._0_8_ = auVar230._0_8_ ^ 0xffffffffffffffff;
            auVar231._8_4_ = auVar230._8_4_ ^ 0xffffffff;
            auVar231._12_4_ = auVar230._12_4_ ^ 0xffffffff;
            auVar231._16_4_ = auVar230._16_4_ ^ 0xffffffff;
            auVar231._20_4_ = auVar230._20_4_ ^ 0xffffffff;
            auVar231._24_4_ = auVar230._24_4_ ^ 0xffffffff;
            auVar231._28_4_ = auVar230._28_4_ ^ 0xffffffff;
            auVar230 = vorps_avx(auVar9,auVar231);
            auVar230 = vandps_avx(auVar11,auVar230);
          }
        }
        auVar296 = local_980._0_28_;
        auVar261 = ZEXT3264(_local_7e0);
        local_340 = _local_7e0;
        local_320 = vminps_avx(local_2e0,auVar241);
        _local_540 = vmaxps_avx(_local_7e0,auVar249);
        auVar242 = ZEXT3264(_local_540);
        _local_300 = _local_540;
        auVar6 = vcmpps_avx(_local_7e0,local_320,2);
        local_620 = vandps_avx(auVar6,auVar119);
        auVar6 = vcmpps_avx(_local_540,local_2e0,2);
        local_5c0 = vandps_avx(auVar6,auVar119);
        auVar214 = ZEXT3264(local_5c0);
        auVar119 = vorps_avx(local_5c0,local_620);
        if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0x7f,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar119 >> 0xbf,0) != '\0') ||
            (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar119[0x1f] < '\0') {
          local_580._0_8_ = auVar230._0_8_ ^ 0xffffffffffffffff;
          local_580._8_4_ = auVar230._8_4_ ^ 0xffffffff;
          local_580._12_4_ = auVar230._12_4_ ^ 0xffffffff;
          local_580._16_4_ = auVar230._16_4_ ^ 0xffffffff;
          local_580._20_4_ = auVar230._20_4_ ^ 0xffffffff;
          local_580._24_4_ = auVar230._24_4_ ^ 0xffffffff;
          local_580._28_4_ = auVar230._28_4_ ^ 0xffffffff;
          auVar214._0_4_ = (float)local_980._0_4_ * auVar178._0_4_;
          auVar214._4_4_ = (float)local_980._4_4_ * auVar178._4_4_;
          auVar214._8_4_ = fStack_978 * auVar178._8_4_;
          auVar214._12_4_ = fStack_974 * auVar178._12_4_;
          auVar214._16_4_ = fStack_970 * auVar178._16_4_;
          auVar214._20_4_ = fStack_96c * auVar178._20_4_;
          auVar214._28_36_ = auVar178._28_36_;
          auVar214._24_4_ = fStack_968 * auVar178._24_4_;
          auVar5 = vfmadd132ps_fma(auVar146,auVar214._0_32_,_local_800);
          auVar5 = vfmadd213ps_fma(auVar116,_local_a40,ZEXT1632(auVar5));
          auVar67._4_4_ = uStack_81c;
          auVar67._0_4_ = local_820;
          auVar67._8_4_ = uStack_818;
          auVar67._12_4_ = uStack_814;
          auVar67._16_4_ = uStack_810;
          auVar67._20_4_ = uStack_80c;
          auVar67._24_4_ = uStack_808;
          auVar67._28_4_ = uStack_804;
          auVar119 = vandps_avx(ZEXT1632(auVar5),auVar67);
          auVar148._8_4_ = 0x3e99999a;
          auVar148._0_8_ = 0x3e99999a3e99999a;
          auVar148._12_4_ = 0x3e99999a;
          auVar148._16_4_ = 0x3e99999a;
          auVar148._20_4_ = 0x3e99999a;
          auVar148._24_4_ = 0x3e99999a;
          auVar148._28_4_ = 0x3e99999a;
          auVar119 = vcmpps_avx(auVar119,auVar148,1);
          auVar119 = vorps_avx(auVar119,local_580);
          auVar149._8_4_ = 3;
          auVar149._0_8_ = 0x300000003;
          auVar149._12_4_ = 3;
          auVar149._16_4_ = 3;
          auVar149._20_4_ = 3;
          auVar149._24_4_ = 3;
          auVar149._28_4_ = 3;
          auVar175._8_4_ = 2;
          auVar175._0_8_ = 0x200000002;
          auVar175._12_4_ = 2;
          auVar175._16_4_ = 2;
          auVar175._20_4_ = 2;
          auVar175._24_4_ = 2;
          auVar175._28_4_ = 2;
          auVar119 = vblendvps_avx(auVar175,auVar149,auVar119);
          uVar91 = (undefined4)uVar92;
          local_2c0._4_4_ = uVar91;
          local_2c0._0_4_ = uVar91;
          local_2c0._8_4_ = uVar91;
          local_2c0._12_4_ = uVar91;
          local_2c0._16_4_ = uVar91;
          local_2c0._20_4_ = uVar91;
          local_2c0._24_4_ = uVar91;
          local_2c0._28_4_ = uVar91;
          local_520 = vpcmpgtd_avx2(auVar119,local_2c0);
          local_5a0 = vpandn_avx2(local_520,local_620);
          auVar214 = ZEXT3264(local_5a0);
          auVar119 = local_620 & ~local_520;
          auStack_5f8 = auVar30._8_24_;
          local_600 = uVar92;
          local_560 = local_5c0;
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0x7f,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0xbf,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar119[0x1f] < '\0') {
            auVar258 = vminps_avx(local_a70,local_a90);
            auVar5 = vmaxps_avx(local_a70,local_a90);
            auVar105 = vminps_avx(local_a80,_local_aa0);
            auVar234 = vminps_avx(auVar258,auVar105);
            auVar258 = vmaxps_avx(local_a80,_local_aa0);
            auVar105 = vmaxps_avx(auVar5,auVar258);
            auVar5 = vandps_avx(auVar234,local_ab0);
            auVar258 = vandps_avx(auVar105,local_ab0);
            auVar5 = vmaxps_avx(auVar5,auVar258);
            auVar258 = vmovshdup_avx(auVar5);
            auVar258 = vmaxss_avx(auVar258,auVar5);
            auVar5 = vshufpd_avx(auVar5,auVar5,1);
            auVar5 = vmaxss_avx(auVar5,auVar258);
            local_8e0._0_4_ = auVar5._0_4_ * 1.9073486e-06;
            local_780 = vshufps_avx(auVar105,auVar105,0xff);
            local_7c0._4_4_ = (float)local_7e0._4_4_ + fVar123;
            local_7c0._0_4_ = (float)local_7e0._0_4_ + fVar123;
            fStack_7b8 = fStack_7d8 + fVar123;
            fStack_7b4 = fStack_7d4 + fVar123;
            fStack_7b0 = fStack_7d0 + fVar123;
            fStack_7ac = fStack_7cc + fVar123;
            fStack_7a8 = fStack_7c8 + fVar123;
            fStack_7a4 = fStack_7c4 + fVar123;
            do {
              auVar150._8_4_ = 0x7f800000;
              auVar150._0_8_ = 0x7f8000007f800000;
              auVar150._12_4_ = 0x7f800000;
              auVar150._16_4_ = 0x7f800000;
              auVar150._20_4_ = 0x7f800000;
              auVar150._24_4_ = 0x7f800000;
              auVar150._28_4_ = 0x7f800000;
              auVar119 = auVar214._0_32_;
              auVar230 = vblendvps_avx(auVar150,_local_7e0,auVar119);
              auVar6 = vshufps_avx(auVar230,auVar230,0xb1);
              auVar6 = vminps_avx(auVar230,auVar6);
              auVar9 = vshufpd_avx(auVar6,auVar6,5);
              auVar6 = vminps_avx(auVar6,auVar9);
              auVar9 = vpermpd_avx2(auVar6,0x4e);
              auVar6 = vminps_avx(auVar6,auVar9);
              auVar230 = vcmpps_avx(auVar230,auVar6,0);
              auVar6 = auVar119 & auVar230;
              if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar6 >> 0x7f,0) != '\0') ||
                    (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar6 >> 0xbf,0) != '\0') ||
                  (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar6[0x1f] < '\0') {
                auVar119 = vandps_avx(auVar230,auVar119);
              }
              local_7a0._0_8_ = uVar90;
              uVar86 = vmovmskps_avx(auVar119);
              iVar17 = 0;
              for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar87 = iVar17 << 2;
              *(undefined4 *)(local_5a0 + uVar87) = 0;
              uVar86 = *(uint *)(local_4e0 + uVar87);
              fVar279 = *(float *)(local_340 + uVar87);
              fVar201 = local_ae4;
              if ((float)local_940._0_4_ < 0.0) {
                auVar271 = ZEXT1664(auVar271._0_16_);
                fVar201 = sqrtf((float)local_940._0_4_);
              }
              auVar261 = ZEXT464(uVar86);
              local_700._0_4_ = fVar201 * 1.9073486e-06;
              lVar89 = 5;
              do {
                fVar254 = auVar261._0_4_;
                fVar243 = 1.0 - fVar254;
                local_a00._0_16_ = ZEXT416((uint)fVar243);
                fVar219 = fVar243 * fVar243 * fVar243;
                fVar216 = fVar254 * fVar254;
                fVar217 = fVar254 * fVar216;
                auVar258 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar219),
                                           ZEXT416((uint)fVar217));
                fVar201 = fVar254 * fVar243;
                auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar201 * 6.0)),
                                           ZEXT416((uint)(fVar243 * fVar201)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar234 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * fVar201 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar254 * fVar201)));
                auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                         ZEXT416((uint)fVar219));
                fVar215 = (auVar5._0_4_ + auVar234._0_4_) * 0.16666667;
                fVar217 = fVar217 * 0.16666667;
                auVar133._0_4_ = fVar217 * (float)local_aa0._0_4_;
                auVar133._4_4_ = fVar217 * (float)local_aa0._4_4_;
                auVar133._8_4_ = fVar217 * fStack_a98;
                auVar133._12_4_ = fVar217 * fStack_a94;
                auVar183._4_4_ = fVar215;
                auVar183._0_4_ = fVar215;
                auVar183._8_4_ = fVar215;
                auVar183._12_4_ = fVar215;
                auVar5 = vfmadd132ps_fma(auVar183,auVar133,local_a80);
                fVar215 = (auVar258._0_4_ + auVar105._0_4_) * 0.16666667;
                auVar134._4_4_ = fVar215;
                auVar134._0_4_ = fVar215;
                auVar134._8_4_ = fVar215;
                auVar134._12_4_ = fVar215;
                auVar5 = vfmadd132ps_fma(auVar134,auVar5,local_a90);
                auVar159._4_4_ = fVar279;
                auVar159._0_4_ = fVar279;
                auVar159._8_4_ = fVar279;
                auVar159._12_4_ = fVar279;
                auVar258 = vfmadd213ps_fma(auVar159,local_930,_DAT_01feba10);
                fVar219 = fVar219 * 0.16666667;
                auVar100._4_4_ = fVar219;
                auVar100._0_4_ = fVar219;
                auVar100._8_4_ = fVar219;
                auVar100._12_4_ = fVar219;
                auVar5 = vfmadd132ps_fma(auVar100,auVar5,local_a70);
                local_920._0_16_ = auVar5;
                auVar5 = vsubps_avx(auVar258,auVar5);
                _local_900 = auVar5;
                auVar5 = vdpps_avx(auVar5,auVar5,0x7f);
                fVar215 = auVar5._0_4_;
                auVar258 = auVar261._0_16_;
                if (fVar215 < 0.0) {
                  local_a00._0_16_ = ZEXT416((uint)fVar243);
                  local_a20._0_4_ = fVar216;
                  local_ae0._0_4_ = fVar201;
                  auVar271 = ZEXT1664(auVar271._0_16_);
                  auVar242._0_4_ = sqrtf(fVar215);
                  auVar242._4_60_ = extraout_var;
                  auVar105 = auVar242._0_16_;
                  fVar216 = (float)local_a20._0_4_;
                  fVar201 = (float)local_ae0._0_4_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar5,auVar5);
                }
                fVar217 = local_a00._0_4_;
                auVar101._4_4_ = fVar217;
                auVar101._0_4_ = fVar217;
                auVar101._8_4_ = fVar217;
                auVar101._12_4_ = fVar217;
                auVar7 = vfnmsub213ss_fma(auVar258,auVar258,ZEXT416((uint)(fVar201 * 4.0)));
                auVar234 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * 4.0)),local_a00._0_16_,
                                           local_a00._0_16_);
                fVar201 = fVar217 * -fVar217 * 0.5;
                fVar217 = auVar7._0_4_ * 0.5;
                fVar219 = auVar234._0_4_ * 0.5;
                fVar216 = fVar216 * 0.5;
                auVar225._0_4_ = (float)local_aa0._0_4_ * fVar216;
                auVar225._4_4_ = (float)local_aa0._4_4_ * fVar216;
                auVar225._8_4_ = fStack_a98 * fVar216;
                auVar225._12_4_ = fStack_a94 * fVar216;
                auVar184._4_4_ = fVar219;
                auVar184._0_4_ = fVar219;
                auVar184._8_4_ = fVar219;
                auVar184._12_4_ = fVar219;
                auVar234 = vfmadd213ps_fma(auVar184,local_a80,auVar225);
                auVar204._4_4_ = fVar217;
                auVar204._0_4_ = fVar217;
                auVar204._8_4_ = fVar217;
                auVar204._12_4_ = fVar217;
                auVar234 = vfmadd213ps_fma(auVar204,local_a90,auVar234);
                auVar275._4_4_ = fVar201;
                auVar275._0_4_ = fVar201;
                auVar275._8_4_ = fVar201;
                auVar275._12_4_ = fVar201;
                auVar8 = vfmadd213ps_fma(auVar275,local_a70,auVar234);
                auVar234 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a00._0_16_,auVar258)
                ;
                auVar258 = vfmadd231ss_fma(local_a00._0_16_,auVar258,SUB6416(ZEXT464(0xc0000000),0))
                ;
                auVar185._0_4_ = (float)local_aa0._0_4_ * fVar254;
                auVar185._4_4_ = (float)local_aa0._4_4_ * fVar254;
                auVar185._8_4_ = fStack_a98 * fVar254;
                auVar185._12_4_ = fStack_a94 * fVar254;
                uVar91 = auVar258._0_4_;
                auVar205._4_4_ = uVar91;
                auVar205._0_4_ = uVar91;
                auVar205._8_4_ = uVar91;
                auVar205._12_4_ = uVar91;
                auVar258 = vfmadd213ps_fma(auVar205,local_a80,auVar185);
                auVar160._0_4_ = auVar234._0_4_;
                auVar160._4_4_ = auVar160._0_4_;
                auVar160._8_4_ = auVar160._0_4_;
                auVar160._12_4_ = auVar160._0_4_;
                auVar258 = vfmadd213ps_fma(auVar160,local_a90,auVar258);
                auVar99 = vfmadd231ps_fma(auVar258,local_a70,auVar101);
                auVar234 = vdpps_avx(auVar8,auVar8,0x7f);
                auVar258 = vblendps_avx(auVar234,_DAT_01feba10,0xe);
                auVar7 = vrsqrtss_avx(auVar258,auVar258);
                fVar201 = auVar7._0_4_;
                fVar219 = auVar234._0_4_;
                fVar201 = fVar201 * 1.5 + fVar219 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar7 = vdpps_avx(auVar8,auVar99,0x7f);
                auVar161._0_4_ = auVar99._0_4_ * fVar219;
                auVar161._4_4_ = auVar99._4_4_ * fVar219;
                auVar161._8_4_ = auVar99._8_4_ * fVar219;
                auVar161._12_4_ = auVar99._12_4_ * fVar219;
                fVar217 = auVar7._0_4_;
                auVar226._0_4_ = auVar8._0_4_ * fVar217;
                auVar226._4_4_ = auVar8._4_4_ * fVar217;
                fVar216 = auVar8._8_4_;
                auVar226._8_4_ = fVar216 * fVar217;
                fVar243 = auVar8._12_4_;
                auVar226._12_4_ = fVar243 * fVar217;
                auVar7 = vsubps_avx(auVar161,auVar226);
                auVar258 = vrcpss_avx(auVar258,auVar258);
                auVar99 = vfnmadd213ss_fma(auVar258,auVar234,ZEXT416(0x40000000));
                fVar217 = auVar258._0_4_ * auVar99._0_4_;
                auVar258 = vmaxss_avx(ZEXT416((uint)local_8e0._0_4_),
                                      ZEXT416((uint)(fVar279 * (float)local_700._0_4_)));
                auVar214 = ZEXT1664(auVar258);
                local_960._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
                local_960._8_4_ = -fVar216;
                local_960._12_4_ = -fVar243;
                auVar186._0_4_ = fVar201 * auVar7._0_4_ * fVar217;
                auVar186._4_4_ = fVar201 * auVar7._4_4_ * fVar217;
                auVar186._8_4_ = fVar201 * auVar7._8_4_ * fVar217;
                auVar186._12_4_ = fVar201 * auVar7._12_4_ * fVar217;
                auVar233._0_4_ = auVar8._0_4_ * fVar201;
                auVar233._4_4_ = auVar8._4_4_ * fVar201;
                auVar233._8_4_ = fVar216 * fVar201;
                auVar233._12_4_ = fVar243 * fVar201;
                local_a00._0_16_ = auVar8;
                local_a20._0_4_ = auVar258._0_4_;
                if (fVar219 < -fVar219) {
                  local_ae0._0_4_ = auVar105._0_4_;
                  local_a60._0_16_ = auVar233;
                  local_9a0._0_16_ = auVar186;
                  auVar271 = ZEXT1664(auVar271._0_16_);
                  fVar201 = sqrtf(fVar219);
                  auVar214 = ZEXT464((uint)local_a20._0_4_);
                  auVar105 = ZEXT416((uint)local_ae0._0_4_);
                  auVar186 = local_9a0._0_16_;
                  auVar233 = local_a60._0_16_;
                }
                else {
                  auVar258 = vsqrtss_avx(auVar234,auVar234);
                  fVar201 = auVar258._0_4_;
                }
                auVar258 = vdpps_avx(_local_900,auVar233,0x7f);
                auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_8e0._0_4_),auVar105,auVar214._0_16_);
                auVar234 = vdpps_avx(local_960._0_16_,auVar233,0x7f);
                auVar7 = vdpps_avx(_local_900,auVar186,0x7f);
                local_ae0._0_16_ = vdpps_avx(local_930,auVar233,0x7f);
                auVar8 = vfmadd213ss_fma(ZEXT416((uint)(auVar105._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_8e0._0_4_ / fVar201)),auVar8);
                auVar287 = ZEXT1664(auVar8);
                fVar201 = auVar234._0_4_ + auVar7._0_4_;
                auVar102._0_4_ = auVar258._0_4_ * auVar258._0_4_;
                auVar102._4_4_ = auVar258._4_4_ * auVar258._4_4_;
                auVar102._8_4_ = auVar258._8_4_ * auVar258._8_4_;
                auVar102._12_4_ = auVar258._12_4_ * auVar258._12_4_;
                auVar105 = vdpps_avx(_local_900,local_960._0_16_,0x7f);
                auVar7 = vsubps_avx(auVar5,auVar102);
                auVar234 = vrsqrtss_avx(auVar7,auVar7);
                fVar219 = auVar7._0_4_;
                fVar217 = auVar234._0_4_;
                fVar217 = fVar217 * 1.5 + fVar219 * -0.5 * fVar217 * fVar217 * fVar217;
                auVar234 = vdpps_avx(_local_900,local_930,0x7f);
                local_960._0_16_ = vfnmadd231ss_fma(auVar105,auVar258,ZEXT416((uint)fVar201));
                auVar105 = vfnmadd231ss_fma(auVar234,auVar258,local_ae0._0_16_);
                if (fVar219 < 0.0) {
                  local_a60._0_16_ = auVar258;
                  local_9a0._0_4_ = auVar8._0_4_;
                  local_720._0_16_ = ZEXT416((uint)fVar201);
                  local_740._0_4_ = fVar217;
                  local_760._0_16_ = auVar105;
                  auVar271 = ZEXT1664(auVar271._0_16_);
                  fVar219 = sqrtf(fVar219);
                  auVar287 = ZEXT464((uint)local_9a0._0_4_);
                  auVar214 = ZEXT464((uint)local_a20._0_4_);
                  fVar217 = (float)local_740._0_4_;
                  auVar105 = local_760._0_16_;
                  auVar258 = local_a60._0_16_;
                  auVar234 = local_720._0_16_;
                }
                else {
                  auVar234 = vsqrtss_avx(auVar7,auVar7);
                  fVar219 = auVar234._0_4_;
                  auVar234 = ZEXT416((uint)fVar201);
                }
                auVar278 = ZEXT1664(auVar258);
                auVar242 = ZEXT1664(local_a00._0_16_);
                auVar7 = vpermilps_avx(local_920._0_16_,0xff);
                auVar8 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
                auVar99 = vfmsub213ss_fma(local_960._0_16_,ZEXT416((uint)fVar217),auVar8);
                auVar187._0_8_ = local_ae0._0_8_ ^ 0x8000000080000000;
                auVar187._8_4_ = local_ae0._8_4_ ^ 0x80000000;
                auVar187._12_4_ = local_ae0._12_4_ ^ 0x80000000;
                auVar206._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
                auVar206._8_4_ = auVar99._8_4_ ^ 0x80000000;
                auVar206._12_4_ = auVar99._12_4_ ^ 0x80000000;
                auVar105 = ZEXT416((uint)(auVar105._0_4_ * fVar217));
                auVar99 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * local_ae0._0_4_)),auVar234,
                                          auVar105);
                auVar105 = vinsertps_avx(auVar105,auVar187,0x10);
                uVar91 = auVar99._0_4_;
                auVar188._4_4_ = uVar91;
                auVar188._0_4_ = uVar91;
                auVar188._8_4_ = uVar91;
                auVar188._12_4_ = uVar91;
                auVar105 = vdivps_avx(auVar105,auVar188);
                auVar99 = ZEXT416((uint)(fVar219 - auVar7._0_4_));
                auVar7 = vinsertps_avx(auVar258,auVar99,0x10);
                auVar162._0_4_ = auVar7._0_4_ * auVar105._0_4_;
                auVar162._4_4_ = auVar7._4_4_ * auVar105._4_4_;
                auVar162._8_4_ = auVar7._8_4_ * auVar105._8_4_;
                auVar162._12_4_ = auVar7._12_4_ * auVar105._12_4_;
                auVar105 = vinsertps_avx(auVar206,auVar234,0x1c);
                auVar105 = vdivps_avx(auVar105,auVar188);
                auVar234 = vhaddps_avx(auVar162,auVar162);
                auVar189._0_4_ = auVar7._0_4_ * auVar105._0_4_;
                auVar189._4_4_ = auVar7._4_4_ * auVar105._4_4_;
                auVar189._8_4_ = auVar7._8_4_ * auVar105._8_4_;
                auVar189._12_4_ = auVar7._12_4_ * auVar105._12_4_;
                auVar105 = vhaddps_avx(auVar189,auVar189);
                fVar254 = fVar254 - auVar234._0_4_;
                auVar261 = ZEXT464((uint)fVar254);
                fVar279 = fVar279 - auVar105._0_4_;
                auVar258 = vandps_avx(auVar258,local_ab0);
                bVar51 = true;
                auVar296 = local_980._0_28_;
                if (auVar258._0_4_ < auVar287._0_4_) {
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(auVar214._0_4_ + auVar287._0_4_)),
                                             local_780,ZEXT416(0x36000000));
                  auVar258 = vandps_avx(auVar99,local_ab0);
                  if (auVar258._0_4_ < auVar105._0_4_) {
                    fVar279 = fVar279 + (float)local_8b0._0_4_;
                    if (fVar94 <= fVar279) {
                      fVar201 = *(float *)(ray + k * 4 + 0x80);
                      auVar278 = ZEXT464((uint)fVar201);
                      if (((fVar279 <= fVar201) && (0.0 <= fVar254)) && (fVar254 <= 1.0)) {
                        auVar5 = vrsqrtss_avx(auVar5,auVar5);
                        fVar217 = auVar5._0_4_;
                        pGVar3 = (context->scene->geometries).items[local_af0].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                          unaff_BL = 0;
                        }
                        else {
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            fVar215 = fVar217 * 1.5 + fVar215 * -0.5 * fVar217 * fVar217 * fVar217;
                            auVar135._0_4_ = fVar215 * (float)local_900._0_4_;
                            auVar135._4_4_ = fVar215 * (float)local_900._4_4_;
                            auVar135._8_4_ = fVar215 * fStack_8f8;
                            auVar135._12_4_ = fVar215 * fStack_8f4;
                            auVar234 = vfmadd213ps_fma(auVar8,auVar135,local_a00._0_16_);
                            auVar5 = vshufps_avx(auVar135,auVar135,0xc9);
                            auVar258 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                            auVar136._0_4_ = auVar135._0_4_ * auVar258._0_4_;
                            auVar136._4_4_ = auVar135._4_4_ * auVar258._4_4_;
                            auVar136._8_4_ = auVar135._8_4_ * auVar258._8_4_;
                            auVar136._12_4_ = auVar135._12_4_ * auVar258._12_4_;
                            auVar105 = vfmsub231ps_fma(auVar136,local_a00._0_16_,auVar5);
                            auVar5 = vshufps_avx(auVar105,auVar105,0xc9);
                            auVar258 = vshufps_avx(auVar234,auVar234,0xc9);
                            auVar105 = vshufps_avx(auVar105,auVar105,0xd2);
                            auVar103._0_4_ = auVar234._0_4_ * auVar105._0_4_;
                            auVar103._4_4_ = auVar234._4_4_ * auVar105._4_4_;
                            auVar103._8_4_ = auVar234._8_4_ * auVar105._8_4_;
                            auVar103._12_4_ = auVar234._12_4_ * auVar105._12_4_;
                            auVar5 = vfmsub231ps_fma(auVar103,auVar5,auVar258);
                            local_6c0 = (RTCHitN  [16])vshufps_avx(auVar5,auVar5,0x55);
                            auStack_6b0 = vshufps_avx(auVar5,auVar5,0xaa);
                            local_6a0 = auVar5._0_4_;
                            local_680 = ZEXT416(0) << 0x20;
                            local_670 = CONCAT44(uStack_6dc,local_6e0);
                            uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                            local_660._4_4_ = uStack_6cc;
                            local_660._0_4_ = local_6d0;
                            local_660._8_4_ = uStack_6c8;
                            local_660._12_4_ = uStack_6c4;
                            vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                            uStack_64c = context->user->instID[0];
                            local_650 = uStack_64c;
                            uStack_648 = uStack_64c;
                            uStack_644 = uStack_64c;
                            uStack_640 = context->user->instPrimID[0];
                            uStack_63c = uStack_640;
                            uStack_638 = uStack_640;
                            uStack_634 = uStack_640;
                            *(float *)(ray + k * 4 + 0x80) = fVar279;
                            local_b00 = *local_9d8;
                            uStack_af8 = local_9d8[1];
                            local_9d0.valid = (int *)&local_b00;
                            local_9d0.geometryUserPtr = pGVar3->userPtr;
                            local_9d0.context = context->user;
                            local_9d0.hit = local_6c0;
                            local_9d0.N = 4;
                            local_920._0_4_ = fVar201;
                            local_9d0.ray = (RTCRayN *)ray;
                            uStack_69c = local_6a0;
                            uStack_698 = local_6a0;
                            uStack_694 = local_6a0;
                            local_690 = fVar254;
                            fStack_68c = fVar254;
                            fStack_688 = fVar254;
                            fStack_684 = fVar254;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar242 = ZEXT1664(local_a00._0_16_);
                              auVar271 = ZEXT1664(auVar271._0_16_);
                              auVar287 = ZEXT1664(auVar287._0_16_);
                              (*pGVar3->occlusionFilterN)(&local_9d0);
                              auVar278 = ZEXT464((uint)local_920._0_4_);
                              auVar261 = ZEXT1664(ZEXT416((uint)fVar254));
                            }
                            auVar296 = local_980._0_28_;
                            auVar60._8_8_ = uStack_af8;
                            auVar60._0_8_ = local_b00;
                            if (auVar60 == (undefined1  [16])0x0) {
                              auVar5 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                              auVar5 = auVar5 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar242 = ZEXT1664(auVar242._0_16_);
                                auVar271 = ZEXT1664(auVar271._0_16_);
                                auVar287 = ZEXT1664(auVar287._0_16_);
                                (*p_Var4)(&local_9d0);
                                auVar278 = ZEXT464((uint)local_920._0_4_);
                                auVar261 = ZEXT1664(ZEXT416((uint)fVar254));
                                auVar296 = local_980._0_28_;
                              }
                              auVar61._8_8_ = uStack_af8;
                              auVar61._0_8_ = local_b00;
                              auVar258 = vpcmpeqd_avx((undefined1  [16])0x0,auVar61);
                              auVar5 = auVar258 ^ _DAT_01febe20;
                              auVar163._8_4_ = 0xff800000;
                              auVar163._0_8_ = 0xff800000ff800000;
                              auVar163._12_4_ = 0xff800000;
                              auVar258 = vblendvps_avx(auVar163,*(undefined1 (*) [16])
                                                                 (local_9d0.ray + 0x80),auVar258);
                              *(undefined1 (*) [16])(local_9d0.ray + 0x80) = auVar258;
                            }
                            auVar137._8_8_ = 0x100000001;
                            auVar137._0_8_ = 0x100000001;
                            unaff_BL = (auVar137 & auVar5) != (undefined1  [16])0x0;
                            if (!(bool)unaff_BL) {
                              *(int *)(ray + k * 4 + 0x80) = auVar278._0_4_;
                            }
                            bVar51 = false;
                            goto LAB_01705e49;
                          }
                          unaff_BL = 1;
                        }
                        bVar51 = false;
                        goto LAB_01705e49;
                      }
                    }
                    bVar51 = false;
                    unaff_BL = 0;
                  }
                }
LAB_01705e49:
                if (!bVar51) goto LAB_017061a3;
                lVar89 = lVar89 + -1;
              } while (lVar89 != 0);
              unaff_BL = 0;
LAB_017061a3:
              unaff_BL = unaff_BL & 1;
              uVar90 = CONCAT71(local_7a0._1_7_,local_7a0[0] | unaff_BL);
              uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar120._4_4_ = uVar91;
              auVar120._0_4_ = uVar91;
              auVar120._8_4_ = uVar91;
              auVar120._12_4_ = uVar91;
              auVar120._16_4_ = uVar91;
              auVar120._20_4_ = uVar91;
              auVar120._24_4_ = uVar91;
              auVar120._28_4_ = uVar91;
              auVar230 = vcmpps_avx(_local_7c0,auVar120,2);
              auVar119 = vandps_avx(auVar230,local_5a0);
              auVar214 = ZEXT3264(auVar119);
              auVar230 = local_5a0 & auVar230;
              uVar92 = local_600;
              local_5a0 = auVar119;
            } while ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar230 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar230 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar230 >> 0x7f,0) != '\0') ||
                       (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar230 >> 0xbf,0) != '\0') ||
                     (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar230[0x1f] < '\0');
          }
          auVar178._0_4_ = auVar296._0_4_ * (float)local_880._0_4_;
          auVar178._4_4_ = auVar296._4_4_ * (float)local_880._4_4_;
          auVar178._8_4_ = auVar296._8_4_ * fStack_878;
          auVar178._12_4_ = auVar296._12_4_ * fStack_874;
          auVar178._16_4_ = auVar296._16_4_ * fStack_870;
          auVar178._20_4_ = auVar296._20_4_ * fStack_86c;
          auVar178._28_36_ = auVar214._28_36_;
          auVar178._24_4_ = auVar296._24_4_ * fStack_868;
          auVar5 = vfmadd132ps_fma(local_860,auVar178._0_32_,_local_800);
          auVar5 = vfmadd213ps_fma(_local_840,_local_a40,ZEXT1632(auVar5));
          auVar68._4_4_ = uStack_81c;
          auVar68._0_4_ = local_820;
          auVar68._8_4_ = uStack_818;
          auVar68._12_4_ = uStack_814;
          auVar68._16_4_ = uStack_810;
          auVar68._20_4_ = uStack_80c;
          auVar68._24_4_ = uStack_808;
          auVar68._28_4_ = uStack_804;
          auVar119 = vandps_avx(ZEXT1632(auVar5),auVar68);
          auVar151._8_4_ = 0x3e99999a;
          auVar151._0_8_ = 0x3e99999a3e99999a;
          auVar151._12_4_ = 0x3e99999a;
          auVar151._16_4_ = 0x3e99999a;
          auVar151._20_4_ = 0x3e99999a;
          auVar151._24_4_ = 0x3e99999a;
          auVar151._28_4_ = 0x3e99999a;
          auVar119 = vcmpps_avx(auVar119,auVar151,1);
          auVar230 = vorps_avx(auVar119,local_580);
          auVar152._0_4_ = fVar123 + (float)local_540._0_4_;
          auVar152._4_4_ = fVar123 + (float)local_540._4_4_;
          auVar152._8_4_ = fVar123 + fStack_538;
          auVar152._12_4_ = fVar123 + fStack_534;
          auVar152._16_4_ = fVar123 + fStack_530;
          auVar152._20_4_ = fVar123 + fStack_52c;
          auVar152._24_4_ = fVar123 + fStack_528;
          auVar152._28_4_ = fVar123 + fStack_524;
          uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar176._4_4_ = uVar91;
          auVar176._0_4_ = uVar91;
          auVar176._8_4_ = uVar91;
          auVar176._12_4_ = uVar91;
          auVar176._16_4_ = uVar91;
          auVar176._20_4_ = uVar91;
          auVar176._24_4_ = uVar91;
          auVar176._28_4_ = uVar91;
          auVar119 = vcmpps_avx(auVar152,auVar176,2);
          local_860 = vandps_avx(auVar119,local_560);
          auVar153._8_4_ = 3;
          auVar153._0_8_ = 0x300000003;
          auVar153._12_4_ = 3;
          auVar153._16_4_ = 3;
          auVar153._20_4_ = 3;
          auVar153._24_4_ = 3;
          auVar153._28_4_ = 3;
          auVar177._8_4_ = 2;
          auVar177._0_8_ = 0x200000002;
          auVar177._12_4_ = 2;
          auVar177._16_4_ = 2;
          auVar177._20_4_ = 2;
          auVar177._24_4_ = 2;
          auVar177._28_4_ = 2;
          auVar119 = vblendvps_avx(auVar177,auVar153,auVar230);
          _local_880 = vpcmpgtd_avx2(auVar119,local_2c0);
          auVar119 = vpandn_avx2(_local_880,local_860);
          auVar230 = local_860 & ~_local_880;
          if ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar230 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar230 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar230 >> 0x7f,0) != '\0') ||
                (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar230 >> 0xbf,0) != '\0') ||
              (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar230[0x1f] < '\0') {
            auVar258 = vminps_avx(local_a70,local_a90);
            auVar5 = vmaxps_avx(local_a70,local_a90);
            auVar105 = vminps_avx(local_a80,_local_aa0);
            auVar234 = vminps_avx(auVar258,auVar105);
            auVar258 = vmaxps_avx(local_a80,_local_aa0);
            auVar105 = vmaxps_avx(auVar5,auVar258);
            auVar5 = vandps_avx(auVar234,local_ab0);
            auVar258 = vandps_avx(auVar105,local_ab0);
            auVar5 = vmaxps_avx(auVar5,auVar258);
            auVar258 = vmovshdup_avx(auVar5);
            auVar258 = vmaxss_avx(auVar258,auVar5);
            auVar5 = vshufpd_avx(auVar5,auVar5,1);
            auVar5 = vmaxss_avx(auVar5,auVar258);
            local_8e0._0_4_ = auVar5._0_4_ * 1.9073486e-06;
            local_780 = vshufps_avx(auVar105,auVar105,0xff);
            _local_7c0 = _local_300;
            local_840._4_4_ = (float)local_300._4_4_ + fVar123;
            local_840._0_4_ = (float)local_300._0_4_ + fVar123;
            fStack_838 = fStack_2f8 + fVar123;
            fStack_834 = fStack_2f4 + fVar123;
            fStack_830 = fStack_2f0 + fVar123;
            fStack_82c = fStack_2ec + fVar123;
            fStack_828 = fStack_2e8 + fVar123;
            fStack_824 = fStack_2e4 + fVar123;
            do {
              auVar154._8_4_ = 0x7f800000;
              auVar154._0_8_ = 0x7f8000007f800000;
              auVar154._12_4_ = 0x7f800000;
              auVar154._16_4_ = 0x7f800000;
              auVar154._20_4_ = 0x7f800000;
              auVar154._24_4_ = 0x7f800000;
              auVar154._28_4_ = 0x7f800000;
              auVar230 = vblendvps_avx(auVar154,_local_7c0,auVar119);
              auVar6 = vshufps_avx(auVar230,auVar230,0xb1);
              auVar6 = vminps_avx(auVar230,auVar6);
              auVar9 = vshufpd_avx(auVar6,auVar6,5);
              auVar6 = vminps_avx(auVar6,auVar9);
              auVar9 = vpermpd_avx2(auVar6,0x4e);
              auVar6 = vminps_avx(auVar6,auVar9);
              auVar6 = vcmpps_avx(auVar230,auVar6,0);
              auVar9 = auVar119 & auVar6;
              auVar230 = auVar119;
              if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar9 >> 0x7f,0) != '\0') ||
                    (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0xbf,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar9[0x1f] < '\0') {
                auVar230 = vandps_avx(auVar6,auVar119);
              }
              local_7a0._0_8_ = uVar90;
              uVar86 = vmovmskps_avx(auVar230);
              iVar17 = 0;
              for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar87 = iVar17 << 2;
              local_5c0 = auVar119;
              *(undefined4 *)(local_5c0 + uVar87) = 0;
              uVar86 = *(uint *)(local_500 + uVar87);
              uVar87 = *(uint *)(local_2e0 + uVar87);
              fVar279 = local_ae8;
              if ((float)local_940._0_4_ < 0.0) {
                fVar279 = sqrtf((float)local_940._0_4_);
              }
              auVar271 = ZEXT464(uVar87);
              auVar261 = ZEXT464(uVar86);
              local_700._0_4_ = fVar279 * 1.9073486e-06;
              lVar89 = 5;
              do {
                fVar243 = auVar261._0_4_;
                fVar216 = 1.0 - fVar243;
                local_a00._0_16_ = ZEXT416((uint)fVar216);
                fVar217 = fVar216 * fVar216 * fVar216;
                fVar219 = fVar243 * fVar243;
                fVar215 = fVar243 * fVar219;
                auVar258 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                           ZEXT416((uint)fVar215));
                fVar201 = fVar243 * fVar216;
                auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * fVar201 * 6.0)),
                                           ZEXT416((uint)(fVar216 * fVar201)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar234 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar201 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar243 * fVar201)));
                auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar215),
                                         ZEXT416((uint)fVar217));
                fVar279 = (auVar5._0_4_ + auVar234._0_4_) * 0.16666667;
                fVar215 = fVar215 * 0.16666667;
                auVar138._0_4_ = fVar215 * (float)local_aa0._0_4_;
                auVar138._4_4_ = fVar215 * (float)local_aa0._4_4_;
                auVar138._8_4_ = fVar215 * fStack_a98;
                auVar138._12_4_ = fVar215 * fStack_a94;
                auVar190._4_4_ = fVar279;
                auVar190._0_4_ = fVar279;
                auVar190._8_4_ = fVar279;
                auVar190._12_4_ = fVar279;
                auVar5 = vfmadd132ps_fma(auVar190,auVar138,local_a80);
                fVar279 = (auVar258._0_4_ + auVar105._0_4_) * 0.16666667;
                auVar139._4_4_ = fVar279;
                auVar139._0_4_ = fVar279;
                auVar139._8_4_ = fVar279;
                auVar139._12_4_ = fVar279;
                auVar5 = vfmadd132ps_fma(auVar139,auVar5,local_a90);
                fVar279 = auVar271._0_4_;
                auVar164._4_4_ = fVar279;
                auVar164._0_4_ = fVar279;
                auVar164._8_4_ = fVar279;
                auVar164._12_4_ = fVar279;
                auVar258 = vfmadd213ps_fma(auVar164,local_930,_DAT_01feba10);
                fVar217 = fVar217 * 0.16666667;
                auVar104._4_4_ = fVar217;
                auVar104._0_4_ = fVar217;
                auVar104._8_4_ = fVar217;
                auVar104._12_4_ = fVar217;
                auVar5 = vfmadd132ps_fma(auVar104,auVar5,local_a70);
                local_920._0_16_ = auVar5;
                auVar5 = vsubps_avx(auVar258,auVar5);
                _local_900 = auVar5;
                auVar5 = vdpps_avx(auVar5,auVar5,0x7f);
                fVar215 = auVar5._0_4_;
                auVar258 = auVar261._0_16_;
                if (fVar215 < 0.0) {
                  local_a00._0_16_ = ZEXT416((uint)fVar216);
                  local_a20._0_4_ = fVar219;
                  local_ae0._0_4_ = fVar201;
                  auVar261._0_4_ = sqrtf(fVar215);
                  auVar261._4_60_ = extraout_var_00;
                  auVar105 = auVar261._0_16_;
                  fVar219 = (float)local_a20._0_4_;
                  fVar201 = (float)local_ae0._0_4_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar5,auVar5);
                }
                fVar217 = local_a00._0_4_;
                auVar106._4_4_ = fVar217;
                auVar106._0_4_ = fVar217;
                auVar106._8_4_ = fVar217;
                auVar106._12_4_ = fVar217;
                auVar7 = vfnmsub213ss_fma(auVar258,auVar258,ZEXT416((uint)(fVar201 * 4.0)));
                auVar234 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * 4.0)),local_a00._0_16_,
                                           local_a00._0_16_);
                fVar201 = fVar217 * -fVar217 * 0.5;
                fVar217 = auVar7._0_4_ * 0.5;
                fVar216 = auVar234._0_4_ * 0.5;
                fVar219 = fVar219 * 0.5;
                auVar227._0_4_ = (float)local_aa0._0_4_ * fVar219;
                auVar227._4_4_ = (float)local_aa0._4_4_ * fVar219;
                auVar227._8_4_ = fStack_a98 * fVar219;
                auVar227._12_4_ = fStack_a94 * fVar219;
                auVar191._4_4_ = fVar216;
                auVar191._0_4_ = fVar216;
                auVar191._8_4_ = fVar216;
                auVar191._12_4_ = fVar216;
                auVar234 = vfmadd213ps_fma(auVar191,local_a80,auVar227);
                auVar207._4_4_ = fVar217;
                auVar207._0_4_ = fVar217;
                auVar207._8_4_ = fVar217;
                auVar207._12_4_ = fVar217;
                auVar234 = vfmadd213ps_fma(auVar207,local_a90,auVar234);
                auVar276._4_4_ = fVar201;
                auVar276._0_4_ = fVar201;
                auVar276._8_4_ = fVar201;
                auVar276._12_4_ = fVar201;
                auVar8 = vfmadd213ps_fma(auVar276,local_a70,auVar234);
                auVar234 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a00._0_16_,auVar258)
                ;
                auVar258 = vfmadd231ss_fma(local_a00._0_16_,auVar258,SUB6416(ZEXT464(0xc0000000),0))
                ;
                auVar192._0_4_ = (float)local_aa0._0_4_ * fVar243;
                auVar192._4_4_ = (float)local_aa0._4_4_ * fVar243;
                auVar192._8_4_ = fStack_a98 * fVar243;
                auVar192._12_4_ = fStack_a94 * fVar243;
                uVar91 = auVar258._0_4_;
                auVar208._4_4_ = uVar91;
                auVar208._0_4_ = uVar91;
                auVar208._8_4_ = uVar91;
                auVar208._12_4_ = uVar91;
                auVar258 = vfmadd213ps_fma(auVar208,local_a80,auVar192);
                auVar165._0_4_ = auVar234._0_4_;
                auVar165._4_4_ = auVar165._0_4_;
                auVar165._8_4_ = auVar165._0_4_;
                auVar165._12_4_ = auVar165._0_4_;
                auVar258 = vfmadd213ps_fma(auVar165,local_a90,auVar258);
                auVar99 = vfmadd231ps_fma(auVar258,local_a70,auVar106);
                auVar234 = vdpps_avx(auVar8,auVar8,0x7f);
                auVar258 = vblendps_avx(auVar234,_DAT_01feba10,0xe);
                auVar7 = vrsqrtss_avx(auVar258,auVar258);
                fVar201 = auVar7._0_4_;
                fVar219 = auVar234._0_4_;
                fVar201 = fVar201 * 1.5 + fVar219 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar7 = vdpps_avx(auVar8,auVar99,0x7f);
                auVar166._0_4_ = auVar99._0_4_ * fVar219;
                auVar166._4_4_ = auVar99._4_4_ * fVar219;
                auVar166._8_4_ = auVar99._8_4_ * fVar219;
                auVar166._12_4_ = auVar99._12_4_ * fVar219;
                fVar217 = auVar7._0_4_;
                auVar228._0_4_ = auVar8._0_4_ * fVar217;
                auVar228._4_4_ = auVar8._4_4_ * fVar217;
                fVar216 = auVar8._8_4_;
                auVar228._8_4_ = fVar216 * fVar217;
                fVar254 = auVar8._12_4_;
                auVar228._12_4_ = fVar254 * fVar217;
                auVar7 = vsubps_avx(auVar166,auVar228);
                auVar258 = vrcpss_avx(auVar258,auVar258);
                auVar99 = vfnmadd213ss_fma(auVar258,auVar234,ZEXT416(0x40000000));
                fVar217 = auVar258._0_4_ * auVar99._0_4_;
                auVar258 = vmaxss_avx(ZEXT416((uint)local_8e0._0_4_),
                                      ZEXT416((uint)(fVar279 * (float)local_700._0_4_)));
                auVar214 = ZEXT1664(auVar258);
                local_960._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
                local_960._8_4_ = -fVar216;
                local_960._12_4_ = -fVar254;
                auVar193._0_4_ = fVar201 * auVar7._0_4_ * fVar217;
                auVar193._4_4_ = fVar201 * auVar7._4_4_ * fVar217;
                auVar193._8_4_ = fVar201 * auVar7._8_4_ * fVar217;
                auVar193._12_4_ = fVar201 * auVar7._12_4_ * fVar217;
                auVar238._0_4_ = auVar8._0_4_ * fVar201;
                auVar238._4_4_ = auVar8._4_4_ * fVar201;
                auVar238._8_4_ = fVar216 * fVar201;
                auVar238._12_4_ = fVar254 * fVar201;
                local_a00._0_16_ = auVar8;
                local_a20._0_4_ = auVar258._0_4_;
                if (fVar219 < -fVar219) {
                  local_ae0._0_4_ = auVar105._0_4_;
                  local_a60._0_16_ = auVar238;
                  local_9a0._0_16_ = auVar193;
                  fVar201 = sqrtf(fVar219);
                  auVar214 = ZEXT464((uint)local_a20._0_4_);
                  auVar105 = ZEXT416((uint)local_ae0._0_4_);
                  auVar193 = local_9a0._0_16_;
                  auVar238 = local_a60._0_16_;
                }
                else {
                  auVar258 = vsqrtss_avx(auVar234,auVar234);
                  fVar201 = auVar258._0_4_;
                }
                auVar258 = vdpps_avx(_local_900,auVar238,0x7f);
                auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_8e0._0_4_),auVar105,auVar214._0_16_);
                auVar234 = vdpps_avx(local_960._0_16_,auVar238,0x7f);
                auVar7 = vdpps_avx(_local_900,auVar193,0x7f);
                local_ae0._0_16_ = vdpps_avx(local_930,auVar238,0x7f);
                auVar8 = vfmadd213ss_fma(ZEXT416((uint)(auVar105._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_8e0._0_4_ / fVar201)),auVar8);
                auVar287 = ZEXT1664(auVar8);
                fVar201 = auVar234._0_4_ + auVar7._0_4_;
                auVar107._0_4_ = auVar258._0_4_ * auVar258._0_4_;
                auVar107._4_4_ = auVar258._4_4_ * auVar258._4_4_;
                auVar107._8_4_ = auVar258._8_4_ * auVar258._8_4_;
                auVar107._12_4_ = auVar258._12_4_ * auVar258._12_4_;
                auVar105 = vdpps_avx(_local_900,local_960._0_16_,0x7f);
                auVar7 = vsubps_avx(auVar5,auVar107);
                auVar234 = vrsqrtss_avx(auVar7,auVar7);
                fVar219 = auVar7._0_4_;
                fVar217 = auVar234._0_4_;
                fVar217 = fVar217 * 1.5 + fVar219 * -0.5 * fVar217 * fVar217 * fVar217;
                auVar234 = vdpps_avx(_local_900,local_930,0x7f);
                local_960._0_16_ = vfnmadd231ss_fma(auVar105,auVar258,ZEXT416((uint)fVar201));
                auVar105 = vfnmadd231ss_fma(auVar234,auVar258,local_ae0._0_16_);
                if (fVar219 < 0.0) {
                  local_a60._0_16_ = auVar258;
                  local_9a0._0_4_ = auVar8._0_4_;
                  local_720._0_16_ = ZEXT416((uint)fVar201);
                  local_740._0_4_ = fVar217;
                  local_760._0_16_ = auVar105;
                  fVar219 = sqrtf(fVar219);
                  auVar287 = ZEXT464((uint)local_9a0._0_4_);
                  auVar214 = ZEXT464((uint)local_a20._0_4_);
                  fVar217 = (float)local_740._0_4_;
                  auVar105 = local_760._0_16_;
                  auVar258 = local_a60._0_16_;
                  auVar234 = local_720._0_16_;
                }
                else {
                  auVar234 = vsqrtss_avx(auVar7,auVar7);
                  fVar219 = auVar234._0_4_;
                  auVar234 = ZEXT416((uint)fVar201);
                }
                auVar278 = ZEXT1664(auVar258);
                auVar242 = ZEXT1664(local_a00._0_16_);
                auVar7 = vpermilps_avx(local_920._0_16_,0xff);
                auVar8 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
                auVar99 = vfmsub213ss_fma(local_960._0_16_,ZEXT416((uint)fVar217),auVar8);
                auVar194._0_8_ = local_ae0._0_8_ ^ 0x8000000080000000;
                auVar194._8_4_ = local_ae0._8_4_ ^ 0x80000000;
                auVar194._12_4_ = local_ae0._12_4_ ^ 0x80000000;
                auVar209._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
                auVar209._8_4_ = auVar99._8_4_ ^ 0x80000000;
                auVar209._12_4_ = auVar99._12_4_ ^ 0x80000000;
                auVar105 = ZEXT416((uint)(auVar105._0_4_ * fVar217));
                auVar99 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * local_ae0._0_4_)),auVar234,
                                          auVar105);
                auVar105 = vinsertps_avx(auVar105,auVar194,0x10);
                uVar91 = auVar99._0_4_;
                auVar195._4_4_ = uVar91;
                auVar195._0_4_ = uVar91;
                auVar195._8_4_ = uVar91;
                auVar195._12_4_ = uVar91;
                auVar105 = vdivps_avx(auVar105,auVar195);
                auVar99 = ZEXT416((uint)(fVar219 - auVar7._0_4_));
                auVar7 = vinsertps_avx(auVar258,auVar99,0x10);
                auVar167._0_4_ = auVar7._0_4_ * auVar105._0_4_;
                auVar167._4_4_ = auVar7._4_4_ * auVar105._4_4_;
                auVar167._8_4_ = auVar7._8_4_ * auVar105._8_4_;
                auVar167._12_4_ = auVar7._12_4_ * auVar105._12_4_;
                auVar105 = vinsertps_avx(auVar209,auVar234,0x1c);
                auVar105 = vdivps_avx(auVar105,auVar195);
                auVar234 = vhaddps_avx(auVar167,auVar167);
                auVar196._0_4_ = auVar7._0_4_ * auVar105._0_4_;
                auVar196._4_4_ = auVar7._4_4_ * auVar105._4_4_;
                auVar196._8_4_ = auVar7._8_4_ * auVar105._8_4_;
                auVar196._12_4_ = auVar7._12_4_ * auVar105._12_4_;
                auVar105 = vhaddps_avx(auVar196,auVar196);
                fVar243 = fVar243 - auVar234._0_4_;
                auVar261 = ZEXT464((uint)fVar243);
                fVar279 = fVar279 - auVar105._0_4_;
                auVar271 = ZEXT464((uint)fVar279);
                auVar105 = vandps_avx(auVar258,local_ab0);
                bVar51 = true;
                if (auVar105._0_4_ < auVar287._0_4_) {
                  auVar234 = vfmadd231ss_fma(ZEXT416((uint)(auVar214._0_4_ + auVar287._0_4_)),
                                             local_780,ZEXT416(0x36000000));
                  auVar105 = vandps_avx(auVar99,local_ab0);
                  if (auVar105._0_4_ < auVar234._0_4_) {
                    fVar279 = fVar279 + (float)local_8b0._0_4_;
                    auVar271 = ZEXT464((uint)fVar279);
                    if ((((fVar94 <= fVar279) &&
                         (fVar201 = *(float *)(ray + k * 4 + 0x80), fVar279 <= fVar201)) &&
                        (0.0 <= fVar243)) && (fVar243 <= 1.0)) {
                      auVar5 = vrsqrtss_avx(auVar5,auVar5);
                      fVar217 = auVar5._0_4_;
                      pGVar3 = (context->scene->geometries).items[local_af0].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_BL = true;
                        }
                        else {
                          fVar215 = fVar217 * 1.5 + fVar215 * -0.5 * fVar217 * fVar217 * fVar217;
                          auVar140._0_4_ = fVar215 * (float)local_900._0_4_;
                          auVar140._4_4_ = fVar215 * (float)local_900._4_4_;
                          auVar140._8_4_ = fVar215 * fStack_8f8;
                          auVar140._12_4_ = fVar215 * fStack_8f4;
                          auVar7 = vfmadd213ps_fma(auVar8,auVar140,local_a00._0_16_);
                          auVar5 = vshufps_avx(auVar140,auVar140,0xc9);
                          auVar105 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                          auVar141._0_4_ = auVar140._0_4_ * auVar105._0_4_;
                          auVar141._4_4_ = auVar140._4_4_ * auVar105._4_4_;
                          auVar141._8_4_ = auVar140._8_4_ * auVar105._8_4_;
                          auVar141._12_4_ = auVar140._12_4_ * auVar105._12_4_;
                          auVar234 = vfmsub231ps_fma(auVar141,local_a00._0_16_,auVar5);
                          auVar5 = vshufps_avx(auVar234,auVar234,0xc9);
                          auVar105 = vshufps_avx(auVar7,auVar7,0xc9);
                          auVar234 = vshufps_avx(auVar234,auVar234,0xd2);
                          auVar108._0_4_ = auVar7._0_4_ * auVar234._0_4_;
                          auVar108._4_4_ = auVar7._4_4_ * auVar234._4_4_;
                          auVar108._8_4_ = auVar7._8_4_ * auVar234._8_4_;
                          auVar108._12_4_ = auVar7._12_4_ * auVar234._12_4_;
                          auVar5 = vfmsub231ps_fma(auVar108,auVar5,auVar105);
                          local_6c0 = (RTCHitN  [16])vshufps_avx(auVar5,auVar5,0x55);
                          auStack_6b0 = vshufps_avx(auVar5,auVar5,0xaa);
                          local_6a0 = auVar5._0_4_;
                          local_680 = ZEXT416(0) << 0x20;
                          local_670 = CONCAT44(uStack_6dc,local_6e0);
                          uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                          local_660._4_4_ = uStack_6cc;
                          local_660._0_4_ = local_6d0;
                          local_660._8_4_ = uStack_6c8;
                          local_660._12_4_ = uStack_6c4;
                          vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                          uStack_64c = context->user->instID[0];
                          local_650 = uStack_64c;
                          uStack_648 = uStack_64c;
                          uStack_644 = uStack_64c;
                          uStack_640 = context->user->instPrimID[0];
                          uStack_63c = uStack_640;
                          uStack_638 = uStack_640;
                          uStack_634 = uStack_640;
                          *(float *)(ray + k * 4 + 0x80) = fVar279;
                          local_b00 = *local_9d8;
                          uStack_af8 = local_9d8[1];
                          local_9d0.valid = (int *)&local_b00;
                          local_9d0.geometryUserPtr = pGVar3->userPtr;
                          local_9d0.context = context->user;
                          local_9d0.hit = local_6c0;
                          local_9d0.N = 4;
                          local_9d0.ray = (RTCRayN *)ray;
                          uStack_69c = local_6a0;
                          uStack_698 = local_6a0;
                          uStack_694 = local_6a0;
                          local_690 = fVar243;
                          fStack_68c = fVar243;
                          fStack_688 = fVar243;
                          fStack_684 = fVar243;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar242 = ZEXT1664(local_a00._0_16_);
                            auVar278 = ZEXT1664(auVar258);
                            auVar287 = ZEXT1664(auVar287._0_16_);
                            (*pGVar3->occlusionFilterN)(&local_9d0);
                            auVar271 = ZEXT1664(ZEXT416((uint)fVar279));
                            auVar261 = ZEXT1664(ZEXT416((uint)fVar243));
                          }
                          auVar62._8_8_ = uStack_af8;
                          auVar62._0_8_ = local_b00;
                          if (auVar62 == (undefined1  [16])0x0) {
                            auVar5 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar5 = auVar5 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar242 = ZEXT1664(auVar242._0_16_);
                              auVar278 = ZEXT1664(auVar278._0_16_);
                              auVar287 = ZEXT1664(auVar287._0_16_);
                              (*p_Var4)(&local_9d0);
                              auVar271 = ZEXT1664(ZEXT416((uint)fVar279));
                              auVar261 = ZEXT1664(ZEXT416((uint)fVar243));
                            }
                            auVar63._8_8_ = uStack_af8;
                            auVar63._0_8_ = local_b00;
                            auVar258 = vpcmpeqd_avx((undefined1  [16])0x0,auVar63);
                            auVar5 = auVar258 ^ _DAT_01febe20;
                            auVar168._8_4_ = 0xff800000;
                            auVar168._0_8_ = 0xff800000ff800000;
                            auVar168._12_4_ = 0xff800000;
                            auVar258 = vblendvps_avx(auVar168,*(undefined1 (*) [16])
                                                               (local_9d0.ray + 0x80),auVar258);
                            *(undefined1 (*) [16])(local_9d0.ray + 0x80) = auVar258;
                          }
                          auVar142._8_8_ = 0x100000001;
                          auVar142._0_8_ = 0x100000001;
                          unaff_BL = (auVar142 & auVar5) != (undefined1  [16])0x0;
                          if (!(bool)unaff_BL) {
                            *(float *)(ray + k * 4 + 0x80) = fVar201;
                          }
                        }
                        bVar51 = false;
                        goto LAB_01706979;
                      }
                    }
                    bVar51 = false;
                    unaff_BL = 0;
                  }
                }
LAB_01706979:
                if (!bVar51) goto LAB_01706c6b;
                lVar89 = lVar89 + -1;
              } while (lVar89 != 0);
              unaff_BL = 0;
LAB_01706c6b:
              unaff_BL = unaff_BL & 1;
              uVar90 = CONCAT71(local_7a0._1_7_,local_7a0[0] | unaff_BL);
              uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar121._4_4_ = uVar91;
              auVar121._0_4_ = uVar91;
              auVar121._8_4_ = uVar91;
              auVar121._12_4_ = uVar91;
              auVar121._16_4_ = uVar91;
              auVar121._20_4_ = uVar91;
              auVar121._24_4_ = uVar91;
              auVar121._28_4_ = uVar91;
              auVar230 = vcmpps_avx(_local_840,auVar121,2);
              auVar119 = vandps_avx(auVar230,local_5c0);
              local_5c0 = local_5c0 & auVar230;
              uVar92 = local_600;
            } while ((((((((local_5c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_5c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_5c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_5c0 >> 0x7f,0) != '\0') ||
                       (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_5c0 >> 0xbf,0) != '\0') ||
                     (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_5c0[0x1f] < '\0');
          }
          auVar155._0_4_ = fVar123 + local_340._0_4_;
          auVar155._4_4_ = fVar123 + local_340._4_4_;
          auVar155._8_4_ = fVar123 + local_340._8_4_;
          auVar155._12_4_ = fVar123 + local_340._12_4_;
          auVar155._16_4_ = fVar123 + local_340._16_4_;
          auVar155._20_4_ = fVar123 + local_340._20_4_;
          auVar155._24_4_ = fVar123 + local_340._24_4_;
          auVar155._28_4_ = fVar123 + local_340._28_4_;
          uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar200._4_4_ = uVar91;
          auVar200._0_4_ = uVar91;
          auVar200._8_4_ = uVar91;
          auVar200._12_4_ = uVar91;
          auVar200._16_4_ = uVar91;
          auVar200._20_4_ = uVar91;
          auVar200._24_4_ = uVar91;
          auVar200._28_4_ = uVar91;
          auVar230 = vcmpps_avx(auVar155,auVar200,2);
          auVar119 = vandps_avx(local_520,local_620);
          auVar119 = vandps_avx(auVar230,auVar119);
          auVar212._0_4_ = fVar123 + local_300._0_4_;
          auVar212._4_4_ = fVar123 + local_300._4_4_;
          auVar212._8_4_ = fVar123 + local_300._8_4_;
          auVar212._12_4_ = fVar123 + local_300._12_4_;
          auVar212._16_4_ = fVar123 + local_300._16_4_;
          auVar212._20_4_ = fVar123 + local_300._20_4_;
          auVar212._24_4_ = fVar123 + local_300._24_4_;
          auVar212._28_4_ = fVar123 + local_300._28_4_;
          auVar6 = vcmpps_avx(auVar212,auVar200,2);
          auVar230 = vandps_avx(_local_880,local_860);
          auVar214 = ZEXT3264(auVar230);
          auVar230 = vandps_avx(auVar6,auVar230);
          auVar230 = vorps_avx(auVar119,auVar230);
          if ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar230 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar230 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar230 >> 0x7f,0) != '\0') ||
                (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar230 >> 0xbf,0) != '\0') ||
              (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar230[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar230;
            auVar119 = vblendvps_avx(_local_300,local_340,auVar119);
            *(undefined1 (*) [32])(auStack_160 + uVar93 * 0x60) = auVar119;
            uVar1 = vmovlps_avx(local_8a0);
            *(undefined8 *)(afStack_140 + uVar93 * 0x18) = uVar1;
            auStack_138[uVar93 * 0x18] = (int)uVar92 + 1;
            uVar93 = (ulong)((int)uVar93 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar93 == 0) {
        if ((uVar90 & 1) != 0) {
          return local_b91;
        }
        uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar109._4_4_ = uVar91;
        auVar109._0_4_ = uVar91;
        auVar109._8_4_ = uVar91;
        auVar109._12_4_ = uVar91;
        auVar5 = vcmpps_avx(local_4b0,auVar109,2);
        uVar86 = vmovmskps_avx(auVar5);
        uVar86 = (uint)local_888 & uVar86;
        local_b91 = uVar86 != 0;
        if (!local_b91) {
          return local_b91;
        }
        goto LAB_01704620;
      }
      uVar88 = (ulong)((int)uVar93 - 1);
      lVar89 = uVar88 * 0x60;
      auVar119 = *(undefined1 (*) [32])(auStack_160 + lVar89);
      auVar117._0_4_ = fVar123 + auVar119._0_4_;
      auVar117._4_4_ = fVar123 + auVar119._4_4_;
      auVar117._8_4_ = fVar123 + auVar119._8_4_;
      auVar117._12_4_ = fVar123 + auVar119._12_4_;
      auVar117._16_4_ = fVar123 + auVar119._16_4_;
      auVar117._20_4_ = fVar123 + auVar119._20_4_;
      auVar117._24_4_ = fVar123 + auVar119._24_4_;
      auVar117._28_4_ = fVar123 + auVar119._28_4_;
      uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar199._4_4_ = uVar91;
      auVar199._0_4_ = uVar91;
      auVar199._8_4_ = uVar91;
      auVar199._12_4_ = uVar91;
      auVar199._16_4_ = uVar91;
      auVar199._20_4_ = uVar91;
      auVar199._24_4_ = uVar91;
      auVar199._28_4_ = uVar91;
      auVar230 = vcmpps_avx(auVar117,auVar199,2);
      _local_6c0 = vandps_avx(auVar230,*(undefined1 (*) [32])(auStack_180 + lVar89));
      auVar230 = *(undefined1 (*) [32])(auStack_180 + lVar89) & auVar230;
      bVar58 = (auVar230 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar59 = (auVar230 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar57 = (auVar230 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar56 = SUB321(auVar230 >> 0x7f,0) == '\0';
      bVar55 = (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar54 = SUB321(auVar230 >> 0xbf,0) == '\0';
      bVar52 = (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar51 = -1 < auVar230[0x1f];
      if (((((((!bVar58 || !bVar59) || !bVar57) || !bVar56) || !bVar55) || !bVar54) || !bVar52) ||
          !bVar51) {
        auVar174._8_4_ = 0x7f800000;
        auVar174._0_8_ = 0x7f8000007f800000;
        auVar174._12_4_ = 0x7f800000;
        auVar174._16_4_ = 0x7f800000;
        auVar174._20_4_ = 0x7f800000;
        auVar174._24_4_ = 0x7f800000;
        auVar174._28_4_ = 0x7f800000;
        auVar119 = vblendvps_avx(auVar174,auVar119,_local_6c0);
        auVar230 = vshufps_avx(auVar119,auVar119,0xb1);
        auVar230 = vminps_avx(auVar119,auVar230);
        auVar6 = vshufpd_avx(auVar230,auVar230,5);
        auVar230 = vminps_avx(auVar230,auVar6);
        auVar6 = vpermpd_avx2(auVar230,0x4e);
        auVar230 = vminps_avx(auVar230,auVar6);
        auVar230 = vcmpps_avx(auVar119,auVar230,0);
        auVar6 = _local_6c0 & auVar230;
        auVar119 = _local_6c0;
        if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar6 >> 0x7f,0) != '\0') ||
              (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar6 >> 0xbf,0) != '\0') ||
            (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar6[0x1f] < '\0') {
          auVar119 = vandps_avx(auVar230,_local_6c0);
        }
        fVar279 = afStack_140[uVar88 * 0x18 + 1];
        uVar92 = (ulong)auStack_138[uVar88 * 0x18];
        uVar86 = vmovmskps_avx(auVar119);
        iVar17 = 0;
        for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
          iVar17 = iVar17 + 1;
        }
        fVar201 = afStack_140[uVar88 * 0x18];
        auVar118._4_4_ = fVar201;
        auVar118._0_4_ = fVar201;
        auVar118._8_4_ = fVar201;
        auVar118._12_4_ = fVar201;
        auVar118._16_4_ = fVar201;
        auVar118._20_4_ = fVar201;
        auVar118._24_4_ = fVar201;
        auVar118._28_4_ = fVar201;
        *(undefined4 *)(local_6c0 + (uint)(iVar17 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar89) = _local_6c0;
        if ((((((((_local_6c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_6c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_6c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_6c0 >> 0x7f,0) != '\0') ||
              (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_6c0 >> 0xbf,0) != '\0') ||
            (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_6c0[0x1f] < '\0') {
          uVar88 = uVar93;
        }
        fVar279 = fVar279 - fVar201;
        auVar147._4_4_ = fVar279;
        auVar147._0_4_ = fVar279;
        auVar147._8_4_ = fVar279;
        auVar147._12_4_ = fVar279;
        auVar147._16_4_ = fVar279;
        auVar147._20_4_ = fVar279;
        auVar147._24_4_ = fVar279;
        auVar147._28_4_ = fVar279;
        auVar5 = vfmadd132ps_fma(auVar147,auVar118,_DAT_02020f20);
        local_340 = ZEXT1632(auVar5);
        local_8a0._8_8_ = 0;
        local_8a0._0_8_ = *(ulong *)(local_340 + (uint)(iVar17 << 2));
      }
      uVar93 = uVar88;
      fVar279 = fVar123;
    } while (((((((bVar58 && bVar59) && bVar57) && bVar56) && bVar55) && bVar54) && bVar52) &&
             bVar51);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }